

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_f64.c
# Opt level: O1

void bashF0(u64 *s)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  
  uVar10 = *s;
  uVar4 = s[1];
  uVar2 = s[0x10];
  uVar5 = s[8] ^ uVar10 ^ uVar2;
  uVar16 = (uVar5 << 0x35 | uVar5 >> 0xb) ^ s[8];
  uVar1 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar16;
  uVar10 = (uVar2 << 0xe | uVar2 >> 0x32) ^ uVar2 ^ (uVar16 << 1 | (ulong)((long)uVar16 < 0));
  uVar17 = uVar1 & uVar5 ^ uVar10;
  uVar12 = (~uVar10 | uVar1) ^ uVar5;
  *s = uVar12;
  uVar1 = (uVar10 | uVar5) ^ uVar1;
  s[8] = uVar1;
  s[0x10] = uVar17;
  uVar10 = s[0x11];
  uVar2 = s[9] ^ uVar4 ^ uVar10;
  uVar5 = (uVar2 << 0x33 | uVar2 >> 0xd) ^ s[9];
  uVar3 = (uVar4 << 0x38 | uVar4 >> 8) ^ uVar5;
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar5 << 7 | uVar5 >> 0x39);
  uVar6 = uVar3 & uVar2 ^ uVar10;
  uVar25 = (~uVar10 | uVar3) ^ uVar2;
  s[1] = uVar25;
  uVar3 = (uVar10 | uVar2) ^ uVar3;
  s[9] = uVar3;
  s[0x11] = uVar6;
  uVar10 = s[2];
  uVar4 = s[0x12];
  uVar5 = s[10] ^ uVar10 ^ uVar4;
  uVar16 = (uVar5 << 0x25 | uVar5 >> 0x1b) ^ s[10];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar16;
  uVar10 = (uVar4 << 0x2e | uVar4 >> 0x12) ^ uVar4 ^ (uVar16 << 0x31 | uVar16 >> 0xf);
  uVar18 = uVar2 & uVar5 ^ uVar10;
  uVar13 = (~uVar10 | uVar2) ^ uVar5;
  s[2] = uVar13;
  uVar2 = (uVar10 | uVar5) ^ uVar2;
  s[10] = uVar2;
  s[0x12] = uVar18;
  uVar10 = s[3];
  uVar4 = s[0x13];
  uVar16 = s[0xb] ^ uVar10 ^ uVar4;
  s[3] = uVar16;
  uVar19 = (uVar16 << 3 | uVar16 >> 0x3d) ^ s[0xb];
  uVar5 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar19;
  s[0xb] = uVar5;
  uVar10 = (uVar4 << 2 | uVar4 >> 0x3e) ^ uVar4 ^ (uVar19 << 0x17 | uVar19 >> 0x29);
  uVar7 = uVar5 & uVar16 ^ uVar10;
  uVar29 = (~uVar10 | uVar5) ^ uVar16;
  s[3] = uVar29;
  uVar5 = (uVar10 | uVar16) ^ uVar5;
  s[0xb] = uVar5;
  s[0x13] = uVar7;
  uVar10 = s[4];
  uVar4 = s[0x14];
  uVar19 = s[0xc] ^ uVar10 ^ uVar4;
  uVar20 = (uVar19 << 0x15 | uVar19 >> 0x2b) ^ s[0xc];
  uVar16 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar20;
  uVar10 = (uVar4 << 0xe | uVar4 >> 0x32) ^ uVar4 ^ (uVar20 << 0x21 | uVar20 >> 0x1f);
  s[4] = uVar19;
  uVar14 = uVar16 & uVar19 ^ uVar10;
  uVar8 = (~uVar10 | uVar16) ^ uVar19;
  s[0xc] = uVar16;
  uVar16 = (uVar10 | uVar19) ^ uVar16;
  s[4] = uVar8;
  s[0xc] = uVar16;
  s[0x14] = uVar14;
  uVar10 = s[5];
  uVar4 = s[0x15];
  uVar20 = s[0xd] ^ uVar10 ^ uVar4;
  uVar21 = (uVar20 << 0x13 | uVar20 >> 0x2d) ^ s[0xd];
  uVar19 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar21;
  uVar10 = (uVar4 << 0x22 | uVar4 >> 0x1e) ^ uVar4 ^ (uVar21 << 0x27 | uVar21 >> 0x19);
  s[5] = uVar20;
  uVar15 = uVar19 & uVar20 ^ uVar10;
  uVar30 = (~uVar10 | uVar19) ^ uVar20;
  s[0xd] = uVar19;
  uVar19 = (uVar10 | uVar20) ^ uVar19;
  s[5] = uVar30;
  s[0xd] = uVar19;
  s[0x15] = uVar15;
  uVar10 = s[6];
  uVar4 = s[0x16];
  uVar21 = s[0xe] ^ uVar10 ^ uVar4;
  uVar22 = (uVar21 << 5 | uVar21 >> 0x3b) ^ s[0xe];
  uVar20 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar22;
  uVar10 = (uVar4 << 0x2e | uVar4 >> 0x12) ^ uVar4 ^ (uVar22 << 0x11 | uVar22 >> 0x2f);
  s[6] = uVar21;
  uVar23 = uVar20 & uVar21 ^ uVar10;
  uVar9 = (~uVar10 | uVar20) ^ uVar21;
  s[0xe] = uVar20;
  uVar20 = (uVar10 | uVar21) ^ uVar20;
  s[6] = uVar9;
  s[0xe] = uVar20;
  s[0x16] = uVar23;
  uVar10 = s[7];
  uVar4 = s[0x17];
  uVar22 = s[0xf] ^ uVar10 ^ uVar4;
  uVar33 = (uVar22 << 0x23 | uVar22 >> 0x1d) ^ s[0xf];
  uVar21 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar33;
  uVar10 = (uVar4 << 2 | uVar4 >> 0x3e) ^ uVar4 ^ (uVar33 << 0x37 | uVar33 >> 9);
  s[7] = uVar22;
  s[0xf] = uVar21;
  s[0x17] = uVar10;
  uVar24 = uVar21 & uVar22 ^ uVar10;
  uVar11 = (~uVar10 | uVar21) ^ uVar22;
  uVar21 = (uVar10 | uVar22) ^ uVar21;
  uVar33 = uVar25 ^ 0x3bf5080ac8ba94b1;
  uVar4 = uVar6 ^ uVar21 ^ uVar9;
  uVar6 = (uVar4 << 0x35 | uVar4 >> 0xb) ^ uVar6;
  s[7] = uVar11;
  s[0xf] = uVar21;
  uVar10 = (uVar21 << 8 | uVar21 >> 0x38) ^ uVar6;
  uVar21 = (uVar9 << 0xe | uVar9 >> 0x32) ^ uVar9 ^ (uVar6 << 1 | (ulong)((long)uVar6 < 0));
  s[0x17] = uVar24;
  s[1] = uVar33;
  s[0xf] = uVar4;
  s[0x11] = uVar10;
  s[6] = uVar21;
  uVar26 = uVar10 & uVar4 ^ uVar21;
  uVar27 = (~uVar21 | uVar10) ^ uVar4;
  uVar10 = (uVar21 | uVar4) ^ uVar10;
  uVar21 = uVar2 ^ uVar17 ^ uVar29;
  uVar17 = (uVar21 << 0x33 | uVar21 >> 0xd) ^ uVar17;
  uVar4 = (uVar2 << 0x38 | uVar2 >> 8) ^ uVar17;
  uVar2 = (uVar29 << 0x22 | uVar29 >> 0x1e) ^ uVar29 ^ (uVar17 << 7 | uVar17 >> 0x39);
  s[0xf] = uVar27;
  s[0x11] = uVar10;
  s[6] = uVar26;
  s[10] = uVar21;
  s[0x10] = uVar4;
  s[3] = uVar2;
  uVar17 = uVar4 & uVar21 ^ uVar2;
  uVar22 = (~uVar2 | uVar4) ^ uVar21;
  uVar6 = uVar3 ^ uVar7 ^ uVar12;
  uVar4 = (uVar2 | uVar21) ^ uVar4;
  uVar7 = (uVar6 << 0x25 | uVar6 >> 0x1b) ^ uVar7;
  uVar3 = (uVar3 << 8 | uVar3 >> 0x38) ^ uVar7;
  uVar2 = (uVar12 << 0x2e | uVar12 >> 0x12) ^ uVar12 ^ (uVar7 << 0x31 | uVar7 >> 0xf);
  s[10] = uVar22;
  s[0x10] = uVar4;
  s[3] = uVar17;
  s[9] = uVar6;
  s[0x13] = uVar3;
  *s = uVar2;
  uVar9 = uVar3 & uVar6 ^ uVar2;
  uVar12 = (~uVar2 | uVar3) ^ uVar6;
  uVar3 = (uVar2 | uVar6) ^ uVar3;
  uVar21 = uVar16 ^ uVar18 ^ uVar30;
  uVar18 = (uVar21 << 3 | uVar21 >> 0x3d) ^ uVar18;
  uVar6 = (uVar16 << 0x38 | uVar16 >> 8) ^ uVar18;
  uVar7 = (uVar30 << 2 | uVar30 >> 0x3e) ^ uVar30 ^ (uVar18 << 0x17 | uVar18 >> 0x29);
  s[9] = uVar12;
  s[0x13] = uVar3;
  *s = uVar9;
  s[0xc] = uVar21;
  s[0x12] = uVar6;
  s[5] = uVar7;
  uVar2 = uVar6 & uVar21 ^ uVar7;
  uVar16 = (~uVar7 | uVar6) ^ uVar21;
  uVar6 = (uVar7 | uVar21) ^ uVar6;
  uVar7 = uVar5 ^ uVar15 ^ uVar13;
  uVar15 = (uVar7 << 0x15 | uVar7 >> 0x2b) ^ uVar15;
  uVar29 = (uVar5 << 8 | uVar5 >> 0x38) ^ uVar15;
  uVar18 = (uVar13 << 0xe | uVar13 >> 0x32) ^ uVar13 ^ (uVar15 << 0x21 | uVar15 >> 0x1f);
  s[0xc] = uVar16;
  s[0x12] = uVar6;
  s[5] = uVar2;
  s[0xb] = uVar7;
  s[0x15] = uVar29;
  s[2] = uVar18;
  uVar5 = uVar29 & uVar7 ^ uVar18;
  uVar21 = (~uVar18 | uVar29) ^ uVar7;
  uVar29 = (uVar18 | uVar7) ^ uVar29;
  uVar18 = uVar20 ^ uVar14 ^ uVar11;
  uVar14 = (uVar18 << 0x13 | uVar18 >> 0x2d) ^ uVar14;
  uVar13 = (uVar20 << 0x38 | uVar20 >> 8) ^ uVar14;
  uVar15 = (uVar11 << 0x22 | uVar11 >> 0x1e) ^ uVar11 ^ (uVar14 << 0x27 | uVar14 >> 0x19);
  s[0xb] = uVar21;
  s[0x15] = uVar29;
  s[2] = uVar5;
  s[0xe] = uVar18;
  s[0x14] = uVar13;
  s[7] = uVar15;
  uVar20 = uVar13 & uVar18 ^ uVar15;
  uVar28 = (~uVar15 | uVar13) ^ uVar18;
  uVar7 = uVar19 ^ uVar24 ^ uVar8;
  uVar13 = (uVar15 | uVar18) ^ uVar13;
  uVar24 = (uVar7 << 5 | uVar7 >> 0x3b) ^ uVar24;
  uVar14 = (uVar19 << 8 | uVar19 >> 0x38) ^ uVar24;
  uVar19 = (uVar8 << 0x2e | uVar8 >> 0x12) ^ uVar8 ^ (uVar24 << 0x11 | uVar24 >> 0x2f);
  s[0xe] = uVar28;
  s[0x14] = uVar13;
  s[7] = uVar20;
  s[0xd] = uVar7;
  s[0x17] = uVar14;
  s[4] = uVar19;
  uVar30 = uVar14 & uVar7 ^ uVar19;
  uVar18 = (~uVar19 | uVar14) ^ uVar7;
  uVar14 = (uVar19 | uVar7) ^ uVar14;
  uVar19 = uVar1 ^ uVar23 ^ uVar33;
  uVar23 = (uVar19 << 0x23 | uVar19 >> 0x1d) ^ uVar23;
  uVar8 = (uVar1 << 0x38 | uVar1 >> 8) ^ uVar23;
  uVar33 = (uVar33 << 2 | uVar25 >> 0x3e) ^ uVar33 ^ (uVar23 << 0x37 | uVar23 >> 9);
  s[0xd] = uVar18;
  s[0x17] = uVar14;
  s[4] = uVar30;
  s[8] = uVar19;
  s[0x16] = uVar8;
  s[1] = uVar33;
  uVar1 = uVar8 & uVar19 ^ uVar33;
  uVar15 = (~uVar33 | uVar8) ^ uVar19;
  uVar8 = (uVar33 | uVar19) ^ uVar8;
  uVar22 = uVar22 ^ 0xc1d1659c1bbd92f6;
  s[8] = uVar15;
  s[0x16] = uVar8;
  uVar24 = uVar8 ^ uVar17 ^ uVar18;
  uVar17 = (uVar24 << 0x35 | uVar24 >> 0xb) ^ uVar17;
  uVar11 = (uVar8 << 8 | uVar8 >> 0x38) ^ uVar17;
  uVar33 = (uVar18 << 0xe | uVar18 >> 0x32) ^ uVar18 ^ (uVar17 << 1 | (ulong)((long)uVar17 < 0));
  s[1] = uVar1;
  s[10] = uVar22;
  s[0x16] = uVar24;
  s[3] = uVar11;
  s[0xd] = uVar33;
  uVar7 = uVar11 & uVar24 ^ uVar33;
  uVar19 = (~uVar33 | uVar11) ^ uVar24;
  uVar11 = (uVar33 | uVar24) ^ uVar11;
  uVar8 = uVar3 ^ uVar26 ^ uVar16;
  uVar26 = (uVar8 << 0x33 | uVar8 >> 0xd) ^ uVar26;
  uVar24 = (uVar3 << 0x38 | uVar3 >> 8) ^ uVar26;
  uVar3 = (uVar16 << 0x22 | uVar16 >> 0x1e) ^ uVar16 ^ (uVar26 << 7 | uVar26 >> 0x39);
  s[0x16] = uVar19;
  s[3] = uVar11;
  s[0xd] = uVar7;
  s[0x13] = uVar8;
  s[6] = uVar24;
  s[0xc] = uVar3;
  uVar16 = uVar24 & uVar8 ^ uVar3;
  uVar33 = (~uVar3 | uVar24) ^ uVar8;
  uVar24 = (uVar3 | uVar8) ^ uVar24;
  uVar3 = uVar2 ^ uVar4 ^ uVar27;
  uVar2 = (uVar3 << 0x25 | uVar3 >> 0x1b) ^ uVar2;
  uVar8 = (uVar4 << 8 | uVar4 >> 0x38) ^ uVar2;
  uVar4 = (uVar27 << 0x2e | uVar27 >> 0x12) ^ uVar27 ^ (uVar2 << 0x31 | uVar2 >> 0xf);
  s[0x13] = uVar33;
  s[6] = uVar24;
  s[0xc] = uVar16;
  s[0x10] = uVar3;
  s[5] = uVar8;
  s[0xf] = uVar4;
  uVar18 = uVar8 & uVar3 ^ uVar4;
  uVar23 = (~uVar4 | uVar8) ^ uVar3;
  uVar17 = uVar29 ^ uVar9 ^ uVar28;
  uVar8 = (uVar4 | uVar3) ^ uVar8;
  uVar9 = (uVar17 << 3 | uVar17 >> 0x3d) ^ uVar9;
  uVar4 = (uVar29 << 0x38 | uVar29 >> 8) ^ uVar9;
  uVar2 = (uVar28 << 2 | uVar28 >> 0x3e) ^ uVar28 ^ (uVar9 << 0x17 | uVar9 >> 0x29);
  s[0x10] = uVar23;
  s[5] = uVar8;
  s[0xf] = uVar18;
  s[0x15] = uVar17;
  *s = uVar4;
  s[0xe] = uVar2;
  uVar9 = uVar4 & uVar17 ^ uVar2;
  uVar26 = (~uVar2 | uVar4) ^ uVar17;
  uVar4 = (uVar2 | uVar17) ^ uVar4;
  uVar17 = uVar6 ^ uVar20 ^ uVar12;
  uVar20 = (uVar17 << 0x15 | uVar17 >> 0x2b) ^ uVar20;
  uVar2 = (uVar6 << 8 | uVar6 >> 0x38) ^ uVar20;
  uVar20 = (uVar12 << 0xe | uVar12 >> 0x32) ^ uVar12 ^ (uVar20 << 0x21 | uVar20 >> 0x1f);
  s[0x15] = uVar26;
  *s = uVar4;
  s[0xe] = uVar9;
  s[0x12] = uVar17;
  s[7] = uVar2;
  s[9] = uVar20;
  uVar12 = uVar2 & uVar17 ^ uVar20;
  uVar3 = (~uVar20 | uVar2) ^ uVar17;
  uVar2 = (uVar20 | uVar17) ^ uVar2;
  uVar20 = uVar5 ^ uVar14 ^ uVar15;
  uVar5 = (uVar20 << 0x13 | uVar20 >> 0x2d) ^ uVar5;
  uVar31 = (uVar14 << 0x38 | uVar14 >> 8) ^ uVar5;
  uVar5 = (uVar15 << 0x22 | uVar15 >> 0x1e) ^ uVar15 ^ (uVar5 << 0x27 | uVar5 >> 0x19);
  s[0x12] = uVar3;
  s[7] = uVar2;
  s[9] = uVar12;
  s[0x17] = uVar20;
  s[2] = uVar31;
  s[8] = uVar5;
  uVar6 = uVar31 & uVar20 ^ uVar5;
  uVar14 = (~uVar5 | uVar31) ^ uVar20;
  uVar31 = (uVar5 | uVar20) ^ uVar31;
  uVar5 = uVar1 ^ uVar13 ^ uVar21;
  uVar1 = (uVar5 << 5 | uVar5 >> 0x3b) ^ uVar1;
  uVar29 = (uVar13 << 8 | uVar13 >> 0x38) ^ uVar1;
  uVar20 = (uVar21 << 0x2e | uVar21 >> 0x12) ^ uVar21 ^ (uVar1 << 0x11 | uVar1 >> 0x2f);
  s[0x17] = uVar14;
  s[2] = uVar31;
  s[8] = uVar6;
  s[0x14] = uVar5;
  s[1] = uVar29;
  s[0xb] = uVar20;
  uVar17 = uVar29 & uVar5 ^ uVar20;
  uVar21 = (~uVar20 | uVar29) ^ uVar5;
  uVar1 = uVar30 ^ uVar10 ^ uVar22;
  uVar29 = (uVar20 | uVar5) ^ uVar29;
  uVar30 = (uVar1 << 0x23 | uVar1 >> 0x1d) ^ uVar30;
  uVar10 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar30;
  uVar5 = (uVar22 << 2 | uVar22 >> 0x3e) ^ uVar22 ^ (uVar30 << 0x37 | uVar30 >> 9);
  s[0x14] = uVar21;
  s[1] = uVar29;
  s[0xb] = uVar17;
  s[0x11] = uVar1;
  s[4] = uVar10;
  s[10] = uVar5;
  uVar15 = uVar10 & uVar1 ^ uVar5;
  uVar13 = (~uVar5 | uVar10) ^ uVar1;
  uVar10 = (uVar5 | uVar1) ^ uVar10;
  uVar33 = uVar33 ^ 0x60e8b2ce0ddec97b;
  s[0x11] = uVar13;
  s[4] = uVar10;
  uVar5 = uVar10 ^ uVar16 ^ uVar21;
  uVar16 = (uVar5 << 0x35 | uVar5 >> 0xb) ^ uVar16;
  uVar10 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar16;
  uVar1 = (uVar21 << 0xe | uVar21 >> 0x32) ^ uVar21 ^ (uVar16 << 1 | (ulong)((long)uVar16 < 0));
  s[10] = uVar15;
  s[0x13] = uVar33;
  s[4] = uVar5;
  uVar21 = uVar10 & uVar5 ^ uVar1;
  uVar30 = (~uVar1 | uVar10) ^ uVar5;
  uVar10 = (uVar1 | uVar5) ^ uVar10;
  uVar5 = uVar8 ^ uVar7 ^ uVar26;
  uVar7 = (uVar5 << 0x33 | uVar5 >> 0xd) ^ uVar7;
  uVar1 = (uVar8 << 0x38 | uVar8 >> 8) ^ uVar7;
  uVar16 = (uVar26 << 0x22 | uVar26 >> 0x1e) ^ uVar26 ^ (uVar7 << 7 | uVar7 >> 0x39);
  s[4] = uVar30;
  s[0xc] = uVar10;
  s[0x14] = uVar21;
  s[5] = uVar5;
  uVar8 = uVar1 & uVar5 ^ uVar16;
  uVar20 = (~uVar16 | uVar1) ^ uVar5;
  s[0xd] = uVar1;
  uVar1 = (uVar16 | uVar5) ^ uVar1;
  uVar16 = uVar24 ^ uVar9 ^ uVar19;
  uVar9 = (uVar16 << 0x25 | uVar16 >> 0x1b) ^ uVar9;
  uVar5 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar9;
  uVar19 = (uVar19 << 0x2e | uVar19 >> 0x12) ^ uVar19 ^ (uVar9 << 0x31 | uVar9 >> 0xf);
  s[5] = uVar20;
  s[0xd] = uVar1;
  s[0x15] = uVar8;
  s[6] = uVar16;
  uVar22 = uVar5 & uVar16 ^ uVar19;
  uVar7 = (~uVar19 | uVar5) ^ uVar16;
  s[0xe] = uVar5;
  uVar5 = (uVar19 | uVar16) ^ uVar5;
  uVar16 = uVar18 ^ uVar2 ^ uVar14;
  uVar18 = (uVar16 << 3 | uVar16 >> 0x3d) ^ uVar18;
  uVar25 = (uVar2 << 0x38 | uVar2 >> 8) ^ uVar18;
  uVar2 = (uVar14 << 2 | uVar14 >> 0x3e) ^ uVar14 ^ (uVar18 << 0x17 | uVar18 >> 0x29);
  s[6] = uVar7;
  s[0xe] = uVar5;
  s[0x16] = uVar22;
  s[7] = uVar16;
  uVar19 = uVar25 & uVar16 ^ uVar2;
  uVar32 = (~uVar2 | uVar25) ^ uVar16;
  s[0xf] = uVar25;
  uVar25 = (uVar2 | uVar16) ^ uVar25;
  uVar2 = uVar6 ^ uVar4 ^ uVar23;
  uVar6 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ uVar6;
  uVar27 = (uVar4 << 8 | uVar4 >> 0x38) ^ uVar6;
  uVar4 = (uVar23 << 0xe | uVar23 >> 0x32) ^ uVar23 ^ (uVar6 << 0x21 | uVar6 >> 0x1f);
  s[7] = uVar32;
  s[0xf] = uVar25;
  s[0x17] = uVar19;
  *s = uVar2;
  uVar23 = uVar27 & uVar2 ^ uVar4;
  uVar14 = (~uVar4 | uVar27) ^ uVar2;
  s[8] = uVar27;
  uVar27 = (uVar4 | uVar2) ^ uVar27;
  uVar4 = uVar12 ^ uVar29 ^ uVar13;
  uVar12 = (uVar4 << 0x13 | uVar4 >> 0x2d) ^ uVar12;
  uVar28 = (uVar29 << 0x38 | uVar29 >> 8) ^ uVar12;
  uVar2 = (uVar13 << 0x22 | uVar13 >> 0x1e) ^ uVar13 ^ (uVar12 << 0x27 | uVar12 >> 0x19);
  *s = uVar14;
  s[8] = uVar27;
  s[0x10] = uVar23;
  s[1] = uVar4;
  uVar9 = uVar28 & uVar4 ^ uVar2;
  uVar12 = (~uVar2 | uVar28) ^ uVar4;
  s[9] = uVar28;
  uVar28 = (uVar2 | uVar4) ^ uVar28;
  uVar4 = uVar31 ^ uVar15 ^ uVar3;
  uVar15 = (uVar4 << 5 | uVar4 >> 0x3b) ^ uVar15;
  uVar29 = (uVar31 << 8 | uVar31 >> 0x38) ^ uVar15;
  uVar2 = (uVar3 << 0x2e | uVar3 >> 0x12) ^ uVar3 ^ (uVar15 << 0x11 | uVar15 >> 0x2f);
  s[1] = uVar12;
  s[9] = uVar28;
  s[0x11] = uVar9;
  s[2] = uVar4;
  uVar6 = uVar29 & uVar4 ^ uVar2;
  uVar16 = (~uVar2 | uVar29) ^ uVar4;
  s[10] = uVar29;
  uVar29 = (uVar2 | uVar4) ^ uVar29;
  uVar18 = uVar17 ^ uVar11 ^ uVar33;
  uVar17 = (uVar18 << 0x23 | uVar18 >> 0x1d) ^ uVar17;
  uVar4 = (uVar11 << 0x38 | uVar11 >> 8) ^ uVar17;
  uVar2 = (uVar33 << 2 | uVar33 >> 0x3e) ^ uVar33 ^ (uVar17 << 0x37 | uVar17 >> 9);
  s[2] = uVar16;
  s[10] = uVar29;
  s[0x12] = uVar6;
  s[3] = uVar18;
  s[0xb] = uVar4;
  s[0x13] = uVar2;
  uVar3 = uVar4 & uVar18 ^ uVar2;
  uVar33 = (~uVar2 | uVar4) ^ uVar18;
  uVar4 = (uVar2 | uVar18) ^ uVar4;
  uVar20 = uVar20 ^ 0xec5fb8fe790fbc13;
  uVar2 = uVar8 ^ uVar4 ^ uVar16;
  uVar8 = (uVar2 << 0x35 | uVar2 >> 0xb) ^ uVar8;
  s[3] = uVar33;
  s[0xb] = uVar4;
  uVar13 = (uVar4 << 8 | uVar4 >> 0x38) ^ uVar8;
  uVar4 = (uVar16 << 0xe | uVar16 >> 0x32) ^ uVar16 ^ (uVar8 << 1 | (ulong)((long)uVar8 < 0));
  s[0x13] = uVar3;
  s[5] = uVar20;
  s[0xb] = uVar2;
  s[0x15] = uVar13;
  s[2] = uVar4;
  uVar17 = uVar13 & uVar2 ^ uVar4;
  uVar26 = (~uVar4 | uVar13) ^ uVar2;
  uVar16 = uVar21 ^ uVar5 ^ uVar32;
  uVar13 = (uVar4 | uVar2) ^ uVar13;
  uVar21 = (uVar16 << 0x33 | uVar16 >> 0xd) ^ uVar21;
  uVar24 = (uVar5 << 0x38 | uVar5 >> 8) ^ uVar21;
  uVar2 = (uVar32 << 0x22 | uVar32 >> 0x1e) ^ uVar32 ^ (uVar21 << 7 | uVar21 >> 0x39);
  s[0xb] = uVar26;
  s[0x15] = uVar13;
  s[2] = uVar17;
  s[0xe] = uVar16;
  s[0x14] = uVar24;
  s[7] = uVar2;
  uVar4 = uVar24 & uVar16 ^ uVar2;
  uVar21 = (~uVar2 | uVar24) ^ uVar16;
  uVar24 = (uVar2 | uVar16) ^ uVar24;
  uVar16 = uVar19 ^ uVar1 ^ uVar30;
  uVar19 = (uVar16 << 0x25 | uVar16 >> 0x1b) ^ uVar19;
  uVar18 = (uVar1 << 8 | uVar1 >> 0x38) ^ uVar19;
  uVar5 = (uVar30 << 0x2e | uVar30 >> 0x12) ^ uVar30 ^ (uVar19 << 0x31 | uVar19 >> 0xf);
  s[0xe] = uVar21;
  s[0x14] = uVar24;
  s[7] = uVar4;
  s[0xd] = uVar16;
  s[0x17] = uVar18;
  s[4] = uVar5;
  uVar2 = uVar18 & uVar16 ^ uVar5;
  uVar1 = (~uVar5 | uVar18) ^ uVar16;
  uVar18 = (uVar5 | uVar16) ^ uVar18;
  uVar16 = uVar22 ^ uVar27 ^ uVar12;
  uVar22 = (uVar16 << 3 | uVar16 >> 0x3d) ^ uVar22;
  uVar31 = (uVar27 << 0x38 | uVar27 >> 8) ^ uVar22;
  uVar19 = (uVar12 << 2 | uVar12 >> 0x3e) ^ uVar12 ^ (uVar22 << 0x17 | uVar22 >> 0x29);
  s[0xd] = uVar1;
  s[0x17] = uVar18;
  s[4] = uVar2;
  s[8] = uVar16;
  s[0x16] = uVar31;
  s[1] = uVar19;
  uVar5 = uVar31 & uVar16 ^ uVar19;
  uVar15 = (~uVar19 | uVar31) ^ uVar16;
  uVar31 = (uVar19 | uVar16) ^ uVar31;
  uVar19 = uVar25 ^ uVar9 ^ uVar7;
  uVar9 = (uVar19 << 0x15 | uVar19 >> 0x2b) ^ uVar9;
  uVar16 = (uVar25 << 8 | uVar25 >> 0x38) ^ uVar9;
  uVar7 = (uVar7 << 0xe | uVar7 >> 0x32) ^ uVar7 ^ (uVar9 << 0x21 | uVar9 >> 0x1f);
  s[8] = uVar15;
  s[0x16] = uVar31;
  s[1] = uVar5;
  s[0xf] = uVar19;
  s[0x11] = uVar16;
  s[6] = uVar7;
  uVar12 = uVar16 & uVar19 ^ uVar7;
  uVar8 = (~uVar7 | uVar16) ^ uVar19;
  uVar22 = uVar23 ^ uVar29 ^ uVar33;
  uVar16 = (uVar7 | uVar19) ^ uVar16;
  uVar23 = (uVar22 << 0x13 | uVar22 >> 0x2d) ^ uVar23;
  uVar27 = (uVar29 << 0x38 | uVar29 >> 8) ^ uVar23;
  uVar33 = (uVar33 << 0x22 | uVar33 >> 0x1e) ^ uVar33 ^ (uVar23 << 0x27 | uVar23 >> 0x19);
  s[0xf] = uVar8;
  s[0x11] = uVar16;
  s[6] = uVar12;
  s[10] = uVar22;
  s[0x10] = uVar27;
  s[3] = uVar33;
  uVar19 = uVar27 & uVar22 ^ uVar33;
  uVar7 = (~uVar33 | uVar27) ^ uVar22;
  uVar27 = (uVar33 | uVar22) ^ uVar27;
  uVar22 = uVar28 ^ uVar3 ^ uVar14;
  uVar3 = (uVar22 << 5 | uVar22 >> 0x3b) ^ uVar3;
  uVar29 = (uVar28 << 8 | uVar28 >> 0x38) ^ uVar3;
  uVar3 = (uVar14 << 0x2e | uVar14 >> 0x12) ^ uVar14 ^ (uVar3 << 0x11 | uVar3 >> 0x2f);
  s[10] = uVar7;
  s[0x10] = uVar27;
  s[3] = uVar19;
  s[9] = uVar22;
  s[0x13] = uVar29;
  *s = uVar3;
  uVar30 = uVar29 & uVar22 ^ uVar3;
  uVar33 = (~uVar3 | uVar29) ^ uVar22;
  uVar29 = (uVar3 | uVar22) ^ uVar29;
  uVar22 = uVar10 ^ uVar6 ^ uVar20;
  uVar6 = (uVar22 << 0x23 | uVar22 >> 0x1d) ^ uVar6;
  uVar10 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar6;
  uVar20 = (uVar20 << 2 | uVar20 >> 0x3e) ^ uVar20 ^ (uVar6 << 0x37 | uVar6 >> 9);
  s[9] = uVar33;
  s[0x13] = uVar29;
  *s = uVar30;
  s[0xc] = uVar22;
  s[0x12] = uVar10;
  s[5] = uVar20;
  uVar3 = uVar10 & uVar22 ^ uVar20;
  uVar25 = (~uVar20 | uVar10) ^ uVar22;
  uVar10 = (uVar20 | uVar22) ^ uVar10;
  uVar21 = uVar21 ^ 0xaa043de6436706a7;
  uVar22 = uVar4 ^ uVar10 ^ uVar33;
  uVar4 = (uVar22 << 0x35 | uVar22 >> 0xb) ^ uVar4;
  s[0xc] = uVar25;
  s[0x12] = uVar10;
  uVar20 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar4;
  uVar10 = (uVar33 << 0xe | uVar33 >> 0x32) ^ uVar33 ^ (uVar4 << 1 | (ulong)((long)uVar4 < 0));
  s[5] = uVar3;
  s[0xe] = uVar21;
  s[0x12] = uVar22;
  s[7] = uVar20;
  s[9] = uVar10;
  uVar11 = uVar20 & uVar22 ^ uVar10;
  uVar33 = (~uVar10 | uVar20) ^ uVar22;
  uVar20 = (uVar10 | uVar22) ^ uVar20;
  uVar10 = uVar17 ^ uVar18 ^ uVar15;
  uVar17 = (uVar10 << 0x33 | uVar10 >> 0xd) ^ uVar17;
  uVar23 = (uVar18 << 0x38 | uVar18 >> 8) ^ uVar17;
  uVar4 = (uVar15 << 0x22 | uVar15 >> 0x1e) ^ uVar15 ^ (uVar17 << 7 | uVar17 >> 0x39);
  s[0x12] = uVar33;
  s[7] = uVar20;
  s[9] = uVar11;
  s[0x17] = uVar10;
  s[2] = uVar23;
  s[8] = uVar4;
  uVar14 = uVar23 & uVar10 ^ uVar4;
  uVar15 = (~uVar4 | uVar23) ^ uVar10;
  uVar22 = uVar24 ^ uVar5 ^ uVar26;
  uVar23 = (uVar4 | uVar10) ^ uVar23;
  uVar5 = (uVar22 << 0x25 | uVar22 >> 0x1b) ^ uVar5;
  uVar10 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar5;
  uVar4 = (uVar26 << 0x2e | uVar26 >> 0x12) ^ uVar26 ^ (uVar5 << 0x31 | uVar5 >> 0xf);
  s[0x17] = uVar15;
  s[2] = uVar23;
  s[8] = uVar14;
  s[0x14] = uVar22;
  s[1] = uVar10;
  s[0xb] = uVar4;
  uVar6 = uVar10 & uVar22 ^ uVar4;
  uVar17 = (~uVar4 | uVar10) ^ uVar22;
  uVar10 = (uVar4 | uVar22) ^ uVar10;
  uVar4 = uVar2 ^ uVar16 ^ uVar7;
  uVar2 = (uVar4 << 3 | uVar4 >> 0x3d) ^ uVar2;
  uVar28 = (uVar16 << 0x38 | uVar16 >> 8) ^ uVar2;
  uVar2 = (uVar7 << 2 | uVar7 >> 0x3e) ^ uVar7 ^ (uVar2 << 0x17 | uVar2 >> 0x29);
  s[0x14] = uVar17;
  s[1] = uVar10;
  s[0xb] = uVar6;
  s[0x11] = uVar4;
  s[4] = uVar28;
  s[10] = uVar2;
  uVar22 = uVar28 & uVar4 ^ uVar2;
  uVar7 = (~uVar2 | uVar28) ^ uVar4;
  uVar28 = (uVar2 | uVar4) ^ uVar28;
  uVar2 = uVar31 ^ uVar19 ^ uVar1;
  uVar19 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ uVar19;
  uVar4 = (uVar31 << 8 | uVar31 >> 0x38) ^ uVar19;
  uVar1 = (uVar1 << 0xe | uVar1 >> 0x32) ^ uVar1 ^ (uVar19 << 0x21 | uVar19 >> 0x1f);
  s[0x11] = uVar7;
  s[4] = uVar28;
  s[10] = uVar22;
  s[0x16] = uVar2;
  s[3] = uVar4;
  s[0xd] = uVar1;
  uVar9 = uVar4 & uVar2 ^ uVar1;
  uVar18 = (~uVar1 | uVar4) ^ uVar2;
  uVar4 = (uVar1 | uVar2) ^ uVar4;
  uVar5 = uVar29 ^ uVar12 ^ uVar25;
  uVar12 = (uVar5 << 0x13 | uVar5 >> 0x2d) ^ uVar12;
  uVar2 = (uVar29 << 0x38 | uVar29 >> 8) ^ uVar12;
  uVar1 = (uVar25 << 0x22 | uVar25 >> 0x1e) ^ uVar25 ^ (uVar12 << 0x27 | uVar12 >> 0x19);
  s[0x16] = uVar18;
  s[3] = uVar4;
  s[0xd] = uVar9;
  s[0x13] = uVar5;
  s[6] = uVar2;
  s[0xc] = uVar1;
  uVar19 = uVar2 & uVar5 ^ uVar1;
  uVar25 = (~uVar1 | uVar2) ^ uVar5;
  uVar16 = uVar27 ^ uVar3 ^ uVar8;
  uVar2 = (uVar1 | uVar5) ^ uVar2;
  uVar3 = (uVar16 << 5 | uVar16 >> 0x3b) ^ uVar3;
  uVar12 = (uVar27 << 8 | uVar27 >> 0x38) ^ uVar3;
  uVar3 = (uVar8 << 0x2e | uVar8 >> 0x12) ^ uVar8 ^ (uVar3 << 0x11 | uVar3 >> 0x2f);
  s[0x13] = uVar25;
  s[6] = uVar2;
  s[0xc] = uVar19;
  s[0x10] = uVar16;
  s[5] = uVar12;
  s[0xf] = uVar3;
  uVar1 = uVar12 & uVar16 ^ uVar3;
  uVar5 = (~uVar3 | uVar12) ^ uVar16;
  uVar12 = (uVar3 | uVar16) ^ uVar12;
  uVar16 = uVar30 ^ uVar13 ^ uVar21;
  uVar30 = (uVar16 << 0x23 | uVar16 >> 0x1d) ^ uVar30;
  uVar3 = (uVar13 << 0x38 | uVar13 >> 8) ^ uVar30;
  uVar21 = (uVar21 << 2 | uVar21 >> 0x3e) ^ uVar21 ^ (uVar30 << 0x37 | uVar30 >> 9);
  s[0x10] = uVar5;
  s[5] = uVar12;
  s[0xf] = uVar1;
  s[0x15] = uVar16;
  *s = uVar3;
  s[0xe] = uVar21;
  uVar30 = uVar3 & uVar16 ^ uVar21;
  uVar31 = (~uVar21 | uVar3) ^ uVar16;
  uVar3 = (uVar21 | uVar16) ^ uVar3;
  uVar15 = uVar15 ^ 0x8929ff6a5e535bfd;
  s[0x15] = uVar31;
  *s = uVar3;
  uVar8 = uVar3 ^ uVar14 ^ uVar5;
  uVar14 = (uVar8 << 0x35 | uVar8 >> 0xb) ^ uVar14;
  uVar26 = (uVar3 << 8 | uVar3 >> 0x38) ^ uVar14;
  uVar21 = (uVar5 << 0xe | uVar5 >> 0x32) ^ uVar5 ^ (uVar14 << 1 | (ulong)((long)uVar14 < 0));
  s[0xe] = uVar30;
  s[0x17] = uVar15;
  *s = uVar8;
  uVar14 = uVar26 & uVar8 ^ uVar21;
  uVar5 = (~uVar21 | uVar26) ^ uVar8;
  uVar16 = uVar11 ^ uVar10 ^ uVar7;
  uVar26 = (uVar21 | uVar8) ^ uVar26;
  uVar11 = (uVar16 << 0x33 | uVar16 >> 0xd) ^ uVar11;
  uVar24 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar11;
  uVar10 = (uVar7 << 0x22 | uVar7 >> 0x1e) ^ uVar7 ^ (uVar11 << 7 | uVar11 >> 0x39);
  *s = uVar5;
  s[8] = uVar26;
  s[0x10] = uVar14;
  s[1] = uVar16;
  uVar13 = uVar24 & uVar16 ^ uVar10;
  uVar8 = (~uVar10 | uVar24) ^ uVar16;
  s[9] = uVar24;
  uVar21 = uVar23 ^ uVar22 ^ uVar33;
  uVar24 = (uVar10 | uVar16) ^ uVar24;
  uVar22 = (uVar21 << 0x25 | uVar21 >> 0x1b) ^ uVar22;
  uVar23 = (uVar23 << 8 | uVar23 >> 0x38) ^ uVar22;
  uVar22 = (uVar33 << 0x2e | uVar33 >> 0x12) ^ uVar33 ^ (uVar22 << 0x31 | uVar22 >> 0xf);
  s[1] = uVar8;
  s[9] = uVar24;
  s[0x11] = uVar13;
  s[2] = uVar21;
  uVar10 = uVar23 & uVar21 ^ uVar22;
  uVar16 = (~uVar22 | uVar23) ^ uVar21;
  s[10] = uVar23;
  uVar3 = uVar4 ^ uVar6 ^ uVar25;
  uVar23 = (uVar22 | uVar21) ^ uVar23;
  uVar6 = (uVar3 << 3 | uVar3 >> 0x3d) ^ uVar6;
  uVar29 = (uVar4 << 0x38 | uVar4 >> 8) ^ uVar6;
  uVar4 = (uVar25 << 2 | uVar25 >> 0x3e) ^ uVar25 ^ (uVar6 << 0x17 | uVar6 >> 0x29);
  s[2] = uVar16;
  s[10] = uVar23;
  s[0x12] = uVar10;
  s[3] = uVar3;
  uVar7 = uVar29 & uVar3 ^ uVar4;
  uVar22 = (~uVar4 | uVar29) ^ uVar3;
  s[0xb] = uVar29;
  uVar21 = uVar28 ^ uVar19 ^ uVar17;
  uVar29 = (uVar4 | uVar3) ^ uVar29;
  uVar19 = (uVar21 << 0x15 | uVar21 >> 0x2b) ^ uVar19;
  uVar25 = (uVar28 << 8 | uVar28 >> 0x38) ^ uVar19;
  uVar3 = (uVar17 << 0xe | uVar17 >> 0x32) ^ uVar17 ^ (uVar19 << 0x21 | uVar19 >> 0x1f);
  s[3] = uVar22;
  s[0xb] = uVar29;
  s[0x13] = uVar7;
  s[4] = uVar21;
  uVar11 = uVar25 & uVar21 ^ uVar3;
  uVar4 = (~uVar3 | uVar25) ^ uVar21;
  s[0xc] = uVar25;
  uVar19 = uVar9 ^ uVar12 ^ uVar31;
  uVar25 = (uVar3 | uVar21) ^ uVar25;
  uVar9 = (uVar19 << 0x13 | uVar19 >> 0x2d) ^ uVar9;
  uVar27 = (uVar12 << 0x38 | uVar12 >> 8) ^ uVar9;
  uVar3 = (uVar31 << 0x22 | uVar31 >> 0x1e) ^ uVar31 ^ (uVar9 << 0x27 | uVar9 >> 0x19);
  s[4] = uVar4;
  s[0xc] = uVar25;
  s[0x14] = uVar11;
  s[5] = uVar19;
  uVar9 = uVar27 & uVar19 ^ uVar3;
  uVar28 = (~uVar3 | uVar27) ^ uVar19;
  s[0xd] = uVar27;
  uVar21 = uVar30 ^ uVar2 ^ uVar18;
  uVar27 = (uVar3 | uVar19) ^ uVar27;
  uVar30 = (uVar21 << 5 | uVar21 >> 0x3b) ^ uVar30;
  uVar12 = (uVar2 << 8 | uVar2 >> 0x38) ^ uVar30;
  uVar2 = (uVar18 << 0x2e | uVar18 >> 0x12) ^ uVar18 ^ (uVar30 << 0x11 | uVar30 >> 0x2f);
  s[5] = uVar28;
  s[0xd] = uVar27;
  s[0x15] = uVar9;
  s[6] = uVar21;
  uVar19 = uVar12 & uVar21 ^ uVar2;
  uVar6 = (~uVar2 | uVar12) ^ uVar21;
  s[0xe] = uVar12;
  uVar3 = uVar1 ^ uVar20 ^ uVar15;
  uVar12 = (uVar2 | uVar21) ^ uVar12;
  uVar1 = (uVar3 << 0x23 | uVar3 >> 0x1d) ^ uVar1;
  uVar2 = (uVar20 << 0x38 | uVar20 >> 8) ^ uVar1;
  uVar1 = (uVar15 << 2 | uVar15 >> 0x3e) ^ uVar15 ^ (uVar1 << 0x37 | uVar1 >> 9);
  s[6] = uVar6;
  s[0xe] = uVar12;
  s[0x16] = uVar19;
  s[7] = uVar3;
  s[0xf] = uVar2;
  s[0x17] = uVar1;
  uVar18 = uVar2 & uVar3 ^ uVar1;
  uVar30 = (~uVar1 | uVar2) ^ uVar3;
  uVar2 = (uVar1 | uVar3) ^ uVar2;
  uVar8 = uVar8 ^ 0x98bf1e2c50c97550;
  s[7] = uVar30;
  s[0xf] = uVar2;
  uVar1 = uVar2 ^ uVar13 ^ uVar6;
  uVar13 = (uVar1 << 0x35 | uVar1 >> 0xb) ^ uVar13;
  uVar33 = (uVar2 << 8 | uVar2 >> 0x38) ^ uVar13;
  uVar2 = (uVar6 << 0xe | uVar6 >> 0x32) ^ uVar6 ^ (uVar13 << 1 | (ulong)((long)uVar13 < 0));
  s[0x17] = uVar18;
  s[1] = uVar8;
  s[0xf] = uVar1;
  s[0x11] = uVar33;
  s[6] = uVar2;
  uVar21 = uVar33 & uVar1 ^ uVar2;
  uVar13 = (~uVar2 | uVar33) ^ uVar1;
  uVar33 = (uVar2 | uVar1) ^ uVar33;
  uVar3 = uVar23 ^ uVar14 ^ uVar22;
  uVar14 = (uVar3 << 0x33 | uVar3 >> 0xd) ^ uVar14;
  uVar2 = (uVar23 << 0x38 | uVar23 >> 8) ^ uVar14;
  uVar1 = (uVar22 << 0x22 | uVar22 >> 0x1e) ^ uVar22 ^ (uVar14 << 7 | uVar14 >> 0x39);
  s[0xf] = uVar13;
  s[0x11] = uVar33;
  s[6] = uVar21;
  s[10] = uVar3;
  s[0x10] = uVar2;
  s[3] = uVar1;
  uVar6 = uVar2 & uVar3 ^ uVar1;
  uVar20 = (~uVar1 | uVar2) ^ uVar3;
  uVar2 = (uVar1 | uVar3) ^ uVar2;
  uVar22 = uVar24 ^ uVar7 ^ uVar5;
  uVar7 = (uVar22 << 0x25 | uVar22 >> 0x1b) ^ uVar7;
  uVar1 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar7;
  uVar5 = (uVar5 << 0x2e | uVar5 >> 0x12) ^ uVar5 ^ (uVar7 << 0x31 | uVar7 >> 0xf);
  s[10] = uVar20;
  s[0x10] = uVar2;
  s[3] = uVar6;
  s[9] = uVar22;
  s[0x13] = uVar1;
  *s = uVar5;
  uVar3 = uVar1 & uVar22 ^ uVar5;
  uVar17 = (~uVar5 | uVar1) ^ uVar22;
  uVar1 = (uVar5 | uVar22) ^ uVar1;
  uVar5 = uVar10 ^ uVar25 ^ uVar28;
  uVar10 = (uVar5 << 3 | uVar5 >> 0x3d) ^ uVar10;
  uVar14 = (uVar25 << 0x38 | uVar25 >> 8) ^ uVar10;
  uVar15 = (uVar28 << 2 | uVar28 >> 0x3e) ^ uVar28 ^ (uVar10 << 0x17 | uVar10 >> 0x29);
  s[9] = uVar17;
  s[0x13] = uVar1;
  *s = uVar3;
  s[0xc] = uVar5;
  s[0x12] = uVar14;
  s[5] = uVar15;
  uVar22 = uVar14 & uVar5 ^ uVar15;
  uVar7 = (~uVar15 | uVar14) ^ uVar5;
  uVar10 = uVar9 ^ uVar29 ^ uVar16;
  uVar14 = (uVar15 | uVar5) ^ uVar14;
  uVar9 = (uVar10 << 0x15 | uVar10 >> 0x2b) ^ uVar9;
  uVar29 = (uVar29 << 8 | uVar29 >> 0x38) ^ uVar9;
  uVar5 = (uVar16 << 0xe | uVar16 >> 0x32) ^ uVar16 ^ (uVar9 << 0x21 | uVar9 >> 0x1f);
  s[0xc] = uVar7;
  s[0x12] = uVar14;
  s[5] = uVar22;
  s[0xb] = uVar10;
  s[0x15] = uVar29;
  s[2] = uVar5;
  uVar16 = uVar29 & uVar10 ^ uVar5;
  uVar9 = (~uVar5 | uVar29) ^ uVar10;
  uVar29 = (uVar5 | uVar10) ^ uVar29;
  uVar10 = uVar11 ^ uVar12 ^ uVar30;
  uVar11 = (uVar10 << 0x13 | uVar10 >> 0x2d) ^ uVar11;
  uVar24 = (uVar12 << 0x38 | uVar12 >> 8) ^ uVar11;
  uVar12 = (uVar30 << 0x22 | uVar30 >> 0x1e) ^ uVar30 ^ (uVar11 << 0x27 | uVar11 >> 0x19);
  s[0xb] = uVar9;
  s[0x15] = uVar29;
  s[2] = uVar16;
  s[0xe] = uVar10;
  s[0x14] = uVar24;
  s[7] = uVar12;
  uVar5 = uVar24 & uVar10 ^ uVar12;
  uVar11 = (~uVar12 | uVar24) ^ uVar10;
  uVar24 = (uVar12 | uVar10) ^ uVar24;
  uVar15 = uVar27 ^ uVar18 ^ uVar4;
  uVar18 = (uVar15 << 5 | uVar15 >> 0x3b) ^ uVar18;
  uVar10 = (uVar27 << 8 | uVar27 >> 0x38) ^ uVar18;
  uVar4 = (uVar4 << 0x2e | uVar4 >> 0x12) ^ uVar4 ^ (uVar18 << 0x11 | uVar18 >> 0x2f);
  s[0xe] = uVar11;
  s[0x14] = uVar24;
  s[7] = uVar5;
  s[0xd] = uVar15;
  s[0x17] = uVar10;
  s[4] = uVar4;
  uVar18 = uVar10 & uVar15 ^ uVar4;
  uVar12 = (~uVar4 | uVar10) ^ uVar15;
  uVar10 = (uVar4 | uVar15) ^ uVar10;
  uVar23 = uVar19 ^ uVar26 ^ uVar8;
  uVar19 = (uVar23 << 0x23 | uVar23 >> 0x1d) ^ uVar19;
  uVar15 = (uVar26 << 0x38 | uVar26 >> 8) ^ uVar19;
  uVar4 = (uVar8 << 2 | uVar8 >> 0x3e) ^ uVar8 ^ (uVar19 << 0x37 | uVar19 >> 9);
  s[0xd] = uVar12;
  s[0x17] = uVar10;
  s[4] = uVar18;
  s[8] = uVar23;
  s[0x16] = uVar15;
  s[1] = uVar4;
  uVar19 = uVar15 & uVar23 ^ uVar4;
  uVar8 = (~uVar4 | uVar15) ^ uVar23;
  uVar15 = (uVar4 | uVar23) ^ uVar15;
  uVar20 = uVar20 ^ 0x4c5f8f162864baa8;
  uVar4 = uVar6 ^ uVar15 ^ uVar12;
  uVar6 = (uVar4 << 0x35 | uVar4 >> 0xb) ^ uVar6;
  s[8] = uVar8;
  s[0x16] = uVar15;
  uVar15 = (uVar15 << 8 | uVar15 >> 0x38) ^ uVar6;
  uVar12 = (uVar12 << 0xe | uVar12 >> 0x32) ^ uVar12 ^ (uVar6 << 1 | (ulong)((long)uVar6 < 0));
  s[1] = uVar19;
  s[10] = uVar20;
  s[0x16] = uVar4;
  s[3] = uVar15;
  s[0xd] = uVar12;
  uVar6 = uVar15 & uVar4 ^ uVar12;
  s[0x16] = (~uVar12 | uVar15) ^ uVar4;
  s[3] = (uVar12 | uVar4) ^ uVar15;
  uVar12 = uVar21 ^ uVar1 ^ uVar7;
  uVar21 = (uVar12 << 0x33 | uVar12 >> 0xd) ^ uVar21;
  uVar4 = (uVar1 << 0x38 | uVar1 >> 8) ^ uVar21;
  uVar21 = (uVar7 << 0x22 | uVar7 >> 0x1e) ^ uVar7 ^ (uVar21 << 7 | uVar21 >> 0x39);
  s[0xd] = uVar6;
  s[0x13] = uVar12;
  s[6] = uVar4;
  s[0xc] = uVar21;
  uVar7 = uVar4 & uVar12 ^ uVar21;
  uVar1 = (~uVar21 | uVar4) ^ uVar12;
  s[0x13] = uVar1;
  s[6] = (uVar21 | uVar12) ^ uVar4;
  uVar12 = uVar22 ^ uVar2 ^ uVar13;
  uVar22 = (uVar12 << 0x25 | uVar12 >> 0x1b) ^ uVar22;
  uVar2 = (uVar2 << 8 | uVar2 >> 0x38) ^ uVar22;
  uVar4 = (uVar13 << 0x2e | uVar13 >> 0x12) ^ uVar13 ^ (uVar22 << 0x31 | uVar22 >> 0xf);
  s[0xc] = uVar7;
  s[0x10] = uVar12;
  s[5] = uVar2;
  s[0xf] = uVar4;
  s[0x10] = (~uVar4 | uVar2) ^ uVar12;
  uVar21 = (uVar4 | uVar12) ^ uVar2;
  s[5] = uVar21;
  s[0xf] = uVar2 & uVar12 ^ uVar4;
  uVar4 = uVar3 ^ uVar29 ^ uVar11;
  uVar3 = (uVar4 << 3 | uVar4 >> 0x3d) ^ uVar3;
  uVar22 = (uVar29 << 0x38 | uVar29 >> 8) ^ uVar3;
  uVar2 = (uVar11 << 2 | uVar11 >> 0x3e) ^ uVar11 ^ (uVar3 << 0x17 | uVar3 >> 0x29);
  s[0x15] = uVar4;
  *s = uVar22;
  s[0xe] = uVar2;
  uVar3 = (~uVar2 | uVar22) ^ uVar4;
  s[0x15] = uVar3;
  *s = (uVar2 | uVar4) ^ uVar22;
  s[0xe] = uVar22 & uVar4 ^ uVar2;
  uVar4 = uVar14 ^ uVar5 ^ uVar17;
  uVar5 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar5;
  uVar2 = (uVar14 << 8 | uVar14 >> 0x38) ^ uVar5;
  uVar5 = (uVar17 << 0xe | uVar17 >> 0x32) ^ uVar17 ^ (uVar5 << 0x21 | uVar5 >> 0x1f);
  s[0x12] = uVar4;
  s[7] = uVar2;
  s[9] = uVar5;
  s[0x12] = (~uVar5 | uVar2) ^ uVar4;
  s[7] = (uVar5 | uVar4) ^ uVar2;
  s[9] = uVar2 & uVar4 ^ uVar5;
  uVar4 = uVar16 ^ uVar10 ^ uVar8;
  uVar16 = (uVar4 << 0x13 | uVar4 >> 0x2d) ^ uVar16;
  uVar10 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar16;
  uVar2 = (uVar8 << 0x22 | uVar8 >> 0x1e) ^ uVar8 ^ (uVar16 << 0x27 | uVar16 >> 0x19);
  s[0x17] = uVar4;
  s[2] = uVar10;
  s[8] = uVar2;
  s[0x17] = (~uVar2 | uVar10) ^ uVar4;
  s[2] = (uVar2 | uVar4) ^ uVar10;
  s[8] = uVar10 & uVar4 ^ uVar2;
  uVar5 = uVar24 ^ uVar19 ^ uVar9;
  s[0x14] = uVar5;
  uVar19 = (uVar5 << 5 | uVar5 >> 0x3b) ^ uVar19;
  uVar4 = (uVar24 << 8 | uVar24 >> 0x38) ^ uVar19;
  s[1] = uVar4;
  uVar2 = (uVar9 << 0x2e | uVar9 >> 0x12) ^ uVar9 ^ (uVar19 << 0x11 | uVar19 >> 0x2f);
  s[0xb] = uVar2;
  uVar10 = (~uVar2 | uVar4) ^ uVar5;
  s[0x14] = uVar10;
  s[1] = (uVar2 | uVar5) ^ uVar4;
  s[0xb] = uVar4 & uVar5 ^ uVar2;
  uVar5 = uVar33 ^ uVar18 ^ uVar20;
  s[0x11] = uVar5;
  uVar18 = (uVar5 << 0x23 | uVar5 >> 0x1d) ^ uVar18;
  uVar2 = (uVar33 << 0x38 | uVar33 >> 8) ^ uVar18;
  s[4] = uVar2;
  uVar16 = (uVar20 << 2 | uVar20 >> 0x3e) ^ uVar20 ^ (uVar18 << 0x37 | uVar18 >> 9);
  s[10] = uVar16;
  s[0x11] = (~uVar16 | uVar2) ^ uVar5;
  uVar4 = (uVar16 | uVar5) ^ uVar2;
  s[4] = uVar4;
  s[10] = uVar2 & uVar5 ^ uVar16;
  s[0x13] = uVar1 ^ 0x262fc78b14325d54;
  uVar2 = uVar7 ^ uVar4 ^ uVar10;
  s[4] = uVar2;
  uVar7 = (uVar2 << 0x35 | uVar2 >> 0xb) ^ uVar7;
  uVar4 = (uVar4 << 8 | uVar4 >> 0x38) ^ uVar7;
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar7 << 1 | (ulong)((long)uVar7 < 0));
  s[4] = (~uVar10 | uVar4) ^ uVar2;
  s[0xc] = (uVar10 | uVar2) ^ uVar4;
  s[0x14] = uVar4 & uVar2 ^ uVar10;
  uVar10 = uVar6 ^ uVar21 ^ uVar3;
  s[5] = uVar10;
  uVar6 = (uVar10 << 0x33 | uVar10 >> 0xd) ^ uVar6;
  uVar2 = (uVar21 << 0x38 | uVar21 >> 8) ^ uVar6;
  s[0xd] = uVar2;
  uVar4 = (uVar3 << 0x22 | uVar3 >> 0x1e) ^ uVar3 ^ (uVar6 << 7 | uVar6 >> 0x39);
  s[5] = (~uVar4 | uVar2) ^ uVar10;
  s[0xd] = (uVar10 | uVar4) ^ uVar2;
  s[0x15] = uVar2 & uVar10 ^ uVar4;
  uVar10 = s[6];
  uVar4 = uVar10 ^ s[0x16] ^ s[0xe];
  s[6] = uVar4;
  uVar1 = (uVar4 << 0x25 | uVar4 >> 0x1b) ^ s[0xe];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0xe] = uVar2;
  uVar10 = s[0x16];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x31 | uVar1 >> 0xf);
  s[6] = (~uVar10 | uVar2) ^ uVar4;
  s[0xe] = (uVar10 | uVar4) ^ uVar2;
  s[0x16] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[7];
  uVar4 = uVar10 ^ s[0x17] ^ s[0xf];
  s[7] = uVar4;
  uVar1 = (uVar4 << 3 | uVar4 >> 0x3d) ^ s[0xf];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0xf] = uVar2;
  uVar10 = s[0x17];
  uVar10 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x17 | uVar1 >> 0x29);
  s[7] = (~uVar10 | uVar2) ^ uVar4;
  s[0xf] = (uVar10 | uVar4) ^ uVar2;
  s[0x17] = uVar2 & uVar4 ^ uVar10;
  uVar10 = *s;
  uVar4 = uVar10 ^ s[0x10] ^ s[8];
  *s = uVar4;
  uVar1 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ s[8];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[8] = uVar2;
  uVar10 = s[0x10];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 0x21 | uVar1 >> 0x1f);
  *s = (~uVar10 | uVar2) ^ uVar4;
  s[8] = (uVar10 | uVar4) ^ uVar2;
  s[0x10] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[1];
  uVar4 = uVar10 ^ s[0x11] ^ s[9];
  s[1] = uVar4;
  uVar1 = (uVar4 << 0x13 | uVar4 >> 0x2d) ^ s[9];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[9] = uVar2;
  uVar10 = s[0x11];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 0x27 | uVar1 >> 0x19);
  s[1] = (~uVar10 | uVar2) ^ uVar4;
  s[9] = (uVar10 | uVar4) ^ uVar2;
  s[0x11] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[2];
  uVar4 = uVar10 ^ s[0x12] ^ s[10];
  s[2] = uVar4;
  uVar1 = (uVar4 << 5 | uVar4 >> 0x3b) ^ s[10];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[10] = uVar2;
  uVar10 = s[0x12];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x11 | uVar1 >> 0x2f);
  s[2] = (~uVar10 | uVar2) ^ uVar4;
  s[10] = (uVar10 | uVar4) ^ uVar2;
  s[0x12] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[3];
  uVar4 = uVar10 ^ s[0x13] ^ s[0xb];
  s[3] = uVar4;
  uVar1 = (uVar4 << 0x23 | uVar4 >> 0x1d) ^ s[0xb];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0xb] = uVar2;
  uVar10 = s[0x13];
  uVar1 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x37 | uVar1 >> 9);
  s[0x13] = uVar1;
  s[3] = (~uVar1 | uVar2) ^ uVar4;
  uVar10 = (uVar1 | uVar4) ^ uVar2;
  s[0xb] = uVar10;
  s[0x13] = uVar2 & uVar4 ^ uVar1;
  s[5] = s[5] ^ 0x1317e3c58a192eaa;
  uVar4 = uVar10 ^ s[2] ^ s[0x15];
  s[0xb] = uVar4;
  uVar1 = (uVar4 << 0x35 | uVar4 >> 0xb) ^ s[0x15];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x15] = uVar2;
  uVar10 = s[2];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 1 | (ulong)((long)uVar1 < 0));
  s[0xb] = (~uVar10 | uVar2) ^ uVar4;
  s[0x15] = (uVar10 | uVar4) ^ uVar2;
  s[2] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xe];
  uVar4 = uVar10 ^ s[7] ^ s[0x14];
  s[0xe] = uVar4;
  uVar1 = (uVar4 << 0x33 | uVar4 >> 0xd) ^ s[0x14];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x14] = uVar2;
  uVar10 = s[7];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 7 | uVar1 >> 0x39);
  s[0xe] = (~uVar10 | uVar2) ^ uVar4;
  s[0x14] = (uVar10 | uVar4) ^ uVar2;
  s[7] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xd];
  uVar4 = uVar10 ^ s[4] ^ s[0x17];
  s[0xd] = uVar4;
  uVar1 = (uVar4 << 0x25 | uVar4 >> 0x1b) ^ s[0x17];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x17] = uVar2;
  uVar10 = s[4];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x31 | uVar1 >> 0xf);
  s[0xd] = (~uVar10 | uVar2) ^ uVar4;
  s[0x17] = (uVar10 | uVar4) ^ uVar2;
  s[4] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[8];
  uVar4 = uVar10 ^ s[1] ^ s[0x16];
  s[8] = uVar4;
  uVar1 = (uVar4 << 3 | uVar4 >> 0x3d) ^ s[0x16];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x16] = uVar2;
  uVar10 = s[1];
  uVar10 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x17 | uVar1 >> 0x29);
  s[8] = (~uVar10 | uVar2) ^ uVar4;
  s[0x16] = (uVar10 | uVar4) ^ uVar2;
  s[1] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xf];
  uVar4 = uVar10 ^ s[6] ^ s[0x11];
  s[0xf] = uVar4;
  uVar1 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ s[0x11];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x11] = uVar2;
  uVar10 = s[6];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 0x21 | uVar1 >> 0x1f);
  s[0xf] = (~uVar10 | uVar2) ^ uVar4;
  s[0x11] = (uVar10 | uVar4) ^ uVar2;
  s[6] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[10];
  uVar4 = uVar10 ^ s[3] ^ s[0x10];
  s[10] = uVar4;
  uVar1 = (uVar4 << 0x13 | uVar4 >> 0x2d) ^ s[0x10];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x10] = uVar2;
  uVar10 = s[3];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 0x27 | uVar1 >> 0x19);
  s[10] = (~uVar10 | uVar2) ^ uVar4;
  s[0x10] = (uVar10 | uVar4) ^ uVar2;
  s[3] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[9];
  uVar4 = uVar10 ^ *s ^ s[0x13];
  s[9] = uVar4;
  uVar1 = (uVar4 << 5 | uVar4 >> 0x3b) ^ s[0x13];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x13] = uVar2;
  uVar10 = *s;
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x11 | uVar1 >> 0x2f);
  s[9] = (~uVar10 | uVar2) ^ uVar4;
  s[0x13] = (uVar10 | uVar4) ^ uVar2;
  *s = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xc];
  uVar4 = uVar10 ^ s[5] ^ s[0x12];
  s[0xc] = uVar4;
  uVar1 = (uVar4 << 0x23 | uVar4 >> 0x1d) ^ s[0x12];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x12] = uVar2;
  uVar10 = s[5];
  uVar1 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x37 | uVar1 >> 9);
  s[5] = uVar1;
  s[0xc] = (~uVar1 | uVar2) ^ uVar4;
  uVar10 = (uVar1 | uVar4) ^ uVar2;
  s[0x12] = uVar10;
  s[5] = uVar2 & uVar4 ^ uVar1;
  s[0xe] = s[0xe] ^ 0x98bf1e2c50c9755;
  uVar4 = uVar10 ^ s[9] ^ s[7];
  s[0x12] = uVar4;
  uVar1 = (uVar4 << 0x35 | uVar4 >> 0xb) ^ s[7];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[7] = uVar2;
  uVar10 = s[9];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 1 | (ulong)((long)uVar1 < 0));
  s[0x12] = (~uVar10 | uVar2) ^ uVar4;
  s[7] = (uVar10 | uVar4) ^ uVar2;
  s[9] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0x17];
  uVar2 = uVar10 ^ s[8] ^ s[2];
  s[0x17] = uVar2;
  uVar1 = (uVar2 << 0x33 | uVar2 >> 0xd) ^ s[2];
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[2] = uVar4;
  uVar10 = s[8];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 7 | uVar1 >> 0x39);
  s[0x17] = (~uVar10 | uVar4) ^ uVar2;
  s[2] = (uVar10 | uVar2) ^ uVar4;
  s[8] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x14];
  uVar2 = uVar10 ^ s[0xb] ^ s[1];
  s[0x14] = uVar2;
  uVar1 = (uVar2 << 0x25 | uVar2 >> 0x1b) ^ s[1];
  uVar4 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[1] = uVar4;
  uVar10 = s[0xb];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x31 | uVar1 >> 0xf);
  s[0x14] = (~uVar10 | uVar4) ^ uVar2;
  s[1] = (uVar10 | uVar2) ^ uVar4;
  s[0xb] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x11];
  uVar2 = uVar10 ^ s[10] ^ s[4];
  s[0x11] = uVar2;
  uVar1 = (uVar2 << 3 | uVar2 >> 0x3d) ^ s[4];
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[4] = uVar4;
  uVar10 = s[10];
  uVar10 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x17 | uVar1 >> 0x29);
  s[0x11] = (~uVar10 | uVar4) ^ uVar2;
  s[4] = (uVar10 | uVar2) ^ uVar4;
  s[10] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x16];
  uVar2 = uVar10 ^ s[0xd] ^ s[3];
  s[0x16] = uVar2;
  uVar1 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ s[3];
  uVar4 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[3] = uVar4;
  uVar10 = s[0xd];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 0x21 | uVar1 >> 0x1f);
  s[0x16] = (~uVar10 | uVar4) ^ uVar2;
  s[3] = (uVar10 | uVar2) ^ uVar4;
  s[0xd] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x13];
  uVar2 = uVar10 ^ s[0xc] ^ s[6];
  s[0x13] = uVar2;
  uVar1 = (uVar2 << 0x13 | uVar2 >> 0x2d) ^ s[6];
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[6] = uVar4;
  uVar10 = s[0xc];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 0x27 | uVar1 >> 0x19);
  s[0x13] = (~uVar10 | uVar4) ^ uVar2;
  s[6] = (uVar10 | uVar2) ^ uVar4;
  s[0xc] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x10];
  uVar2 = uVar10 ^ s[0xf] ^ s[5];
  s[0x10] = uVar2;
  uVar1 = (uVar2 << 5 | uVar2 >> 0x3b) ^ s[5];
  uVar4 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[5] = uVar4;
  uVar10 = s[0xf];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x11 | uVar1 >> 0x2f);
  s[0x10] = (~uVar10 | uVar4) ^ uVar2;
  s[5] = (uVar10 | uVar2) ^ uVar4;
  s[0xf] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x15];
  uVar2 = uVar10 ^ s[0xe] ^ *s;
  s[0x15] = uVar2;
  uVar1 = (uVar2 << 0x23 | uVar2 >> 0x1d) ^ *s;
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  *s = uVar4;
  uVar10 = s[0xe];
  uVar1 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x37 | uVar1 >> 9);
  s[0xe] = uVar1;
  s[0x15] = (~uVar1 | uVar4) ^ uVar2;
  uVar10 = (uVar1 | uVar2) ^ uVar4;
  *s = uVar10;
  s[0xe] = uVar4 & uVar2 ^ uVar1;
  s[0x17] = s[0x17] ^ 0xd8ee19681d669304;
  uVar4 = uVar10 ^ s[0x10] ^ s[8];
  *s = uVar4;
  uVar1 = (uVar4 << 0x35 | uVar4 >> 0xb) ^ s[8];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[8] = uVar2;
  uVar10 = s[0x10];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 1 | (ulong)((long)uVar1 < 0));
  *s = (~uVar10 | uVar2) ^ uVar4;
  s[8] = (uVar10 | uVar4) ^ uVar2;
  s[0x10] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[1];
  uVar4 = uVar10 ^ s[0x11] ^ s[9];
  s[1] = uVar4;
  uVar1 = (uVar4 << 0x33 | uVar4 >> 0xd) ^ s[9];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[9] = uVar2;
  uVar10 = s[0x11];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 7 | uVar1 >> 0x39);
  s[1] = (~uVar10 | uVar2) ^ uVar4;
  s[9] = (uVar10 | uVar4) ^ uVar2;
  s[0x11] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[2];
  uVar4 = uVar10 ^ s[0x12] ^ s[10];
  s[2] = uVar4;
  uVar1 = (uVar4 << 0x25 | uVar4 >> 0x1b) ^ s[10];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[10] = uVar2;
  uVar10 = s[0x12];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x31 | uVar1 >> 0xf);
  s[2] = (~uVar10 | uVar2) ^ uVar4;
  s[10] = (uVar10 | uVar4) ^ uVar2;
  s[0x12] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[3];
  uVar4 = uVar10 ^ s[0x13] ^ s[0xb];
  s[3] = uVar4;
  uVar1 = (uVar4 << 3 | uVar4 >> 0x3d) ^ s[0xb];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0xb] = uVar2;
  uVar10 = s[0x13];
  uVar10 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x17 | uVar1 >> 0x29);
  s[3] = (~uVar10 | uVar2) ^ uVar4;
  s[0xb] = (uVar10 | uVar4) ^ uVar2;
  s[0x13] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[4];
  uVar4 = uVar10 ^ s[0x14] ^ s[0xc];
  s[4] = uVar4;
  uVar1 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ s[0xc];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0xc] = uVar2;
  uVar10 = s[0x14];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 0x21 | uVar1 >> 0x1f);
  s[4] = (~uVar10 | uVar2) ^ uVar4;
  s[0xc] = (uVar10 | uVar4) ^ uVar2;
  s[0x14] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[5];
  uVar4 = uVar10 ^ s[0x15] ^ s[0xd];
  s[5] = uVar4;
  uVar1 = (uVar4 << 0x13 | uVar4 >> 0x2d) ^ s[0xd];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0xd] = uVar2;
  uVar10 = s[0x15];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 0x27 | uVar1 >> 0x19);
  s[5] = (~uVar10 | uVar2) ^ uVar4;
  s[0xd] = (uVar10 | uVar4) ^ uVar2;
  s[0x15] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[6];
  uVar4 = uVar10 ^ s[0x16] ^ s[0xe];
  s[6] = uVar4;
  uVar1 = (uVar4 << 5 | uVar4 >> 0x3b) ^ s[0xe];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0xe] = uVar2;
  uVar10 = s[0x16];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x11 | uVar1 >> 0x2f);
  s[6] = (~uVar10 | uVar2) ^ uVar4;
  s[0xe] = (uVar10 | uVar4) ^ uVar2;
  s[0x16] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[7];
  uVar4 = uVar10 ^ s[0x17] ^ s[0xf];
  s[7] = uVar4;
  uVar1 = (uVar4 << 0x23 | uVar4 >> 0x1d) ^ s[0xf];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0xf] = uVar2;
  uVar10 = s[0x17];
  uVar1 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x37 | uVar1 >> 9);
  s[0x17] = uVar1;
  s[7] = (~uVar1 | uVar2) ^ uVar4;
  uVar10 = (uVar1 | uVar4) ^ uVar2;
  s[0xf] = uVar10;
  s[0x17] = uVar2 & uVar4 ^ uVar1;
  s[1] = s[1] ^ 0x6c770cb40eb34982;
  uVar4 = uVar10 ^ s[6] ^ s[0x11];
  s[0xf] = uVar4;
  uVar1 = (uVar4 << 0x35 | uVar4 >> 0xb) ^ s[0x11];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x11] = uVar2;
  uVar10 = s[6];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 1 | (ulong)((long)uVar1 < 0));
  s[0xf] = (~uVar10 | uVar2) ^ uVar4;
  s[0x11] = (uVar10 | uVar4) ^ uVar2;
  s[6] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[10];
  uVar4 = uVar10 ^ s[3] ^ s[0x10];
  s[10] = uVar4;
  uVar1 = (uVar4 << 0x33 | uVar4 >> 0xd) ^ s[0x10];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x10] = uVar2;
  uVar10 = s[3];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 7 | uVar1 >> 0x39);
  s[10] = (~uVar10 | uVar2) ^ uVar4;
  s[0x10] = (uVar10 | uVar4) ^ uVar2;
  s[3] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[9];
  uVar4 = uVar10 ^ *s ^ s[0x13];
  s[9] = uVar4;
  uVar1 = (uVar4 << 0x25 | uVar4 >> 0x1b) ^ s[0x13];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x13] = uVar2;
  uVar10 = *s;
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x31 | uVar1 >> 0xf);
  s[9] = (~uVar10 | uVar2) ^ uVar4;
  s[0x13] = (uVar10 | uVar4) ^ uVar2;
  *s = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xc];
  uVar4 = uVar10 ^ s[5] ^ s[0x12];
  s[0xc] = uVar4;
  uVar1 = (uVar4 << 3 | uVar4 >> 0x3d) ^ s[0x12];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x12] = uVar2;
  uVar10 = s[5];
  uVar10 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x17 | uVar1 >> 0x29);
  s[0xc] = (~uVar10 | uVar2) ^ uVar4;
  s[0x12] = (uVar10 | uVar4) ^ uVar2;
  s[5] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xb];
  uVar4 = uVar10 ^ s[2] ^ s[0x15];
  s[0xb] = uVar4;
  uVar1 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ s[0x15];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x15] = uVar2;
  uVar10 = s[2];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 0x21 | uVar1 >> 0x1f);
  s[0xb] = (~uVar10 | uVar2) ^ uVar4;
  s[0x15] = (uVar10 | uVar4) ^ uVar2;
  s[2] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xe];
  uVar4 = uVar10 ^ s[7] ^ s[0x14];
  s[0xe] = uVar4;
  uVar1 = (uVar4 << 0x13 | uVar4 >> 0x2d) ^ s[0x14];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x14] = uVar2;
  uVar10 = s[7];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 0x27 | uVar1 >> 0x19);
  s[0xe] = (~uVar10 | uVar2) ^ uVar4;
  s[0x14] = (uVar10 | uVar4) ^ uVar2;
  s[7] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xd];
  uVar4 = uVar10 ^ s[4] ^ s[0x17];
  s[0xd] = uVar4;
  uVar1 = (uVar4 << 5 | uVar4 >> 0x3b) ^ s[0x17];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x17] = uVar2;
  uVar10 = s[4];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x11 | uVar1 >> 0x2f);
  s[0xd] = (~uVar10 | uVar2) ^ uVar4;
  s[0x17] = (uVar10 | uVar4) ^ uVar2;
  s[4] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[8];
  uVar4 = uVar10 ^ s[1] ^ s[0x16];
  s[8] = uVar4;
  uVar1 = (uVar4 << 0x23 | uVar4 >> 0x1d) ^ s[0x16];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x16] = uVar2;
  uVar10 = s[1];
  uVar1 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x37 | uVar1 >> 9);
  s[1] = uVar1;
  s[8] = (~uVar1 | uVar2) ^ uVar4;
  uVar10 = (uVar1 | uVar4) ^ uVar2;
  s[0x16] = uVar10;
  s[1] = uVar2 & uVar4 ^ uVar1;
  s[10] = s[10] ^ 0x363b865a0759a4c1;
  uVar4 = uVar10 ^ s[0xd] ^ s[3];
  s[0x16] = uVar4;
  uVar1 = (uVar4 << 0x35 | uVar4 >> 0xb) ^ s[3];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[3] = uVar2;
  uVar10 = s[0xd];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 1 | (ulong)((long)uVar1 < 0));
  s[0x16] = (~uVar10 | uVar2) ^ uVar4;
  s[3] = (uVar10 | uVar4) ^ uVar2;
  s[0xd] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0x13];
  uVar2 = uVar10 ^ s[0xc] ^ s[6];
  s[0x13] = uVar2;
  uVar1 = (uVar2 << 0x33 | uVar2 >> 0xd) ^ s[6];
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[6] = uVar4;
  uVar10 = s[0xc];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 7 | uVar1 >> 0x39);
  s[0x13] = (~uVar10 | uVar4) ^ uVar2;
  s[6] = (uVar10 | uVar2) ^ uVar4;
  s[0xc] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x10];
  uVar2 = uVar10 ^ s[0xf] ^ s[5];
  s[0x10] = uVar2;
  uVar1 = (uVar2 << 0x25 | uVar2 >> 0x1b) ^ s[5];
  uVar4 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[5] = uVar4;
  uVar10 = s[0xf];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x31 | uVar1 >> 0xf);
  s[0x10] = (~uVar10 | uVar4) ^ uVar2;
  s[5] = (uVar10 | uVar2) ^ uVar4;
  s[0xf] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x15];
  uVar2 = uVar10 ^ s[0xe] ^ *s;
  s[0x15] = uVar2;
  uVar1 = (uVar2 << 3 | uVar2 >> 0x3d) ^ *s;
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  *s = uVar4;
  uVar10 = s[0xe];
  uVar10 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x17 | uVar1 >> 0x29);
  s[0x15] = (~uVar10 | uVar4) ^ uVar2;
  *s = (uVar10 | uVar2) ^ uVar4;
  s[0xe] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x12];
  uVar2 = uVar10 ^ s[9] ^ s[7];
  s[0x12] = uVar2;
  uVar1 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ s[7];
  uVar4 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[7] = uVar4;
  uVar10 = s[9];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 0x21 | uVar1 >> 0x1f);
  s[0x12] = (~uVar10 | uVar4) ^ uVar2;
  s[7] = (uVar10 | uVar2) ^ uVar4;
  s[9] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x17];
  uVar2 = uVar10 ^ s[8] ^ s[2];
  s[0x17] = uVar2;
  uVar1 = (uVar2 << 0x13 | uVar2 >> 0x2d) ^ s[2];
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[2] = uVar4;
  uVar10 = s[8];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 0x27 | uVar1 >> 0x19);
  s[0x17] = (~uVar10 | uVar4) ^ uVar2;
  s[2] = (uVar10 | uVar2) ^ uVar4;
  s[8] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x14];
  uVar2 = uVar10 ^ s[0xb] ^ s[1];
  s[0x14] = uVar2;
  uVar1 = (uVar2 << 5 | uVar2 >> 0x3b) ^ s[1];
  uVar4 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[1] = uVar4;
  uVar10 = s[0xb];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x11 | uVar1 >> 0x2f);
  s[0x14] = (~uVar10 | uVar4) ^ uVar2;
  s[1] = (uVar10 | uVar2) ^ uVar4;
  s[0xb] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x11];
  uVar2 = uVar10 ^ s[10] ^ s[4];
  s[0x11] = uVar2;
  uVar1 = (uVar2 << 0x23 | uVar2 >> 0x1d) ^ s[4];
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[4] = uVar4;
  uVar10 = s[10];
  uVar1 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x37 | uVar1 >> 9);
  s[10] = uVar1;
  s[0x11] = (~uVar1 | uVar4) ^ uVar2;
  uVar10 = (uVar1 | uVar2) ^ uVar4;
  s[4] = uVar10;
  s[10] = uVar4 & uVar2 ^ uVar1;
  s[0x13] = s[0x13] ^ 0xc73622b47c4c0ace;
  uVar4 = uVar10 ^ s[0x14] ^ s[0xc];
  s[4] = uVar4;
  uVar1 = (uVar4 << 0x35 | uVar4 >> 0xb) ^ s[0xc];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0xc] = uVar2;
  uVar10 = s[0x14];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 1 | (ulong)((long)uVar1 < 0));
  s[4] = (~uVar10 | uVar2) ^ uVar4;
  s[0xc] = (uVar10 | uVar4) ^ uVar2;
  s[0x14] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[5];
  uVar4 = uVar10 ^ s[0x15] ^ s[0xd];
  s[5] = uVar4;
  uVar1 = (uVar4 << 0x33 | uVar4 >> 0xd) ^ s[0xd];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0xd] = uVar2;
  uVar10 = s[0x15];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 7 | uVar1 >> 0x39);
  s[5] = (~uVar10 | uVar2) ^ uVar4;
  s[0xd] = (uVar10 | uVar4) ^ uVar2;
  s[0x15] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[6];
  uVar4 = uVar10 ^ s[0x16] ^ s[0xe];
  s[6] = uVar4;
  uVar1 = (uVar4 << 0x25 | uVar4 >> 0x1b) ^ s[0xe];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0xe] = uVar2;
  uVar10 = s[0x16];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x31 | uVar1 >> 0xf);
  s[6] = (~uVar10 | uVar2) ^ uVar4;
  s[0xe] = (uVar10 | uVar4) ^ uVar2;
  s[0x16] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[7];
  uVar4 = uVar10 ^ s[0x17] ^ s[0xf];
  s[7] = uVar4;
  uVar1 = (uVar4 << 3 | uVar4 >> 0x3d) ^ s[0xf];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0xf] = uVar2;
  uVar10 = s[0x17];
  uVar10 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x17 | uVar1 >> 0x29);
  s[7] = (~uVar10 | uVar2) ^ uVar4;
  s[0xf] = (uVar10 | uVar4) ^ uVar2;
  s[0x17] = uVar2 & uVar4 ^ uVar10;
  uVar10 = *s;
  uVar4 = uVar10 ^ s[0x10] ^ s[8];
  *s = uVar4;
  uVar1 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ s[8];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[8] = uVar2;
  uVar10 = s[0x10];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 0x21 | uVar1 >> 0x1f);
  *s = (~uVar10 | uVar2) ^ uVar4;
  s[8] = (uVar10 | uVar4) ^ uVar2;
  s[0x10] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[1];
  uVar4 = uVar10 ^ s[0x11] ^ s[9];
  s[1] = uVar4;
  uVar1 = (uVar4 << 0x13 | uVar4 >> 0x2d) ^ s[9];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[9] = uVar2;
  uVar10 = s[0x11];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 0x27 | uVar1 >> 0x19);
  s[1] = (~uVar10 | uVar2) ^ uVar4;
  s[9] = (uVar10 | uVar4) ^ uVar2;
  s[0x11] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[2];
  uVar4 = uVar10 ^ s[0x12] ^ s[10];
  s[2] = uVar4;
  uVar1 = (uVar4 << 5 | uVar4 >> 0x3b) ^ s[10];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[10] = uVar2;
  uVar10 = s[0x12];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x11 | uVar1 >> 0x2f);
  s[2] = (~uVar10 | uVar2) ^ uVar4;
  s[10] = (uVar10 | uVar4) ^ uVar2;
  s[0x12] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[3];
  uVar4 = uVar10 ^ s[0x13] ^ s[0xb];
  s[3] = uVar4;
  uVar1 = (uVar4 << 0x23 | uVar4 >> 0x1d) ^ s[0xb];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0xb] = uVar2;
  uVar10 = s[0x13];
  uVar1 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x37 | uVar1 >> 9);
  s[0x13] = uVar1;
  s[3] = (~uVar1 | uVar2) ^ uVar4;
  uVar10 = (uVar1 | uVar4) ^ uVar2;
  s[0xb] = uVar10;
  s[0x13] = uVar2 & uVar4 ^ uVar1;
  s[5] = s[5] ^ 0x639b115a3e260567;
  uVar4 = uVar10 ^ s[2] ^ s[0x15];
  s[0xb] = uVar4;
  uVar1 = (uVar4 << 0x35 | uVar4 >> 0xb) ^ s[0x15];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x15] = uVar2;
  uVar10 = s[2];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 1 | (ulong)((long)uVar1 < 0));
  s[0xb] = (~uVar10 | uVar2) ^ uVar4;
  s[0x15] = (uVar10 | uVar4) ^ uVar2;
  s[2] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xe];
  uVar4 = uVar10 ^ s[7] ^ s[0x14];
  s[0xe] = uVar4;
  uVar1 = (uVar4 << 0x33 | uVar4 >> 0xd) ^ s[0x14];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x14] = uVar2;
  uVar10 = s[7];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 7 | uVar1 >> 0x39);
  s[0xe] = (~uVar10 | uVar2) ^ uVar4;
  s[0x14] = (uVar10 | uVar4) ^ uVar2;
  s[7] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xd];
  uVar4 = uVar10 ^ s[4] ^ s[0x17];
  s[0xd] = uVar4;
  uVar1 = (uVar4 << 0x25 | uVar4 >> 0x1b) ^ s[0x17];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x17] = uVar2;
  uVar10 = s[4];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x31 | uVar1 >> 0xf);
  s[0xd] = (~uVar10 | uVar2) ^ uVar4;
  s[0x17] = (uVar10 | uVar4) ^ uVar2;
  s[4] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[8];
  uVar4 = uVar10 ^ s[1] ^ s[0x16];
  s[8] = uVar4;
  uVar1 = (uVar4 << 3 | uVar4 >> 0x3d) ^ s[0x16];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x16] = uVar2;
  uVar10 = s[1];
  uVar10 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x17 | uVar1 >> 0x29);
  s[8] = (~uVar10 | uVar2) ^ uVar4;
  s[0x16] = (uVar10 | uVar4) ^ uVar2;
  s[1] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xf];
  uVar4 = uVar10 ^ s[6] ^ s[0x11];
  s[0xf] = uVar4;
  uVar1 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ s[0x11];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x11] = uVar2;
  uVar10 = s[6];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 0x21 | uVar1 >> 0x1f);
  s[0xf] = (~uVar10 | uVar2) ^ uVar4;
  s[0x11] = (uVar10 | uVar4) ^ uVar2;
  s[6] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[10];
  uVar4 = uVar10 ^ s[3] ^ s[0x10];
  s[10] = uVar4;
  uVar1 = (uVar4 << 0x13 | uVar4 >> 0x2d) ^ s[0x10];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x10] = uVar2;
  uVar10 = s[3];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 0x27 | uVar1 >> 0x19);
  s[10] = (~uVar10 | uVar2) ^ uVar4;
  s[0x10] = (uVar10 | uVar4) ^ uVar2;
  s[3] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[9];
  uVar4 = uVar10 ^ *s ^ s[0x13];
  s[9] = uVar4;
  uVar1 = (uVar4 << 5 | uVar4 >> 0x3b) ^ s[0x13];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x13] = uVar2;
  uVar10 = *s;
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x11 | uVar1 >> 0x2f);
  s[9] = (~uVar10 | uVar2) ^ uVar4;
  s[0x13] = (uVar10 | uVar4) ^ uVar2;
  *s = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xc];
  uVar4 = uVar10 ^ s[5] ^ s[0x12];
  s[0xc] = uVar4;
  uVar1 = (uVar4 << 0x23 | uVar4 >> 0x1d) ^ s[0x12];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x12] = uVar2;
  uVar10 = s[5];
  uVar1 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x37 | uVar1 >> 9);
  s[5] = uVar1;
  s[0xc] = (~uVar1 | uVar2) ^ uVar4;
  uVar10 = (uVar1 | uVar4) ^ uVar2;
  s[0x12] = uVar10;
  s[5] = uVar2 & uVar4 ^ uVar1;
  s[0xe] = s[0xe] ^ 0xede6693460f3da1d;
  uVar4 = uVar10 ^ s[9] ^ s[7];
  s[0x12] = uVar4;
  uVar1 = (uVar4 << 0x35 | uVar4 >> 0xb) ^ s[7];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[7] = uVar2;
  uVar10 = s[9];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 1 | (ulong)((long)uVar1 < 0));
  s[0x12] = (~uVar10 | uVar2) ^ uVar4;
  s[7] = (uVar10 | uVar4) ^ uVar2;
  s[9] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0x17];
  uVar2 = uVar10 ^ s[8] ^ s[2];
  s[0x17] = uVar2;
  uVar1 = (uVar2 << 0x33 | uVar2 >> 0xd) ^ s[2];
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[2] = uVar4;
  uVar10 = s[8];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 7 | uVar1 >> 0x39);
  s[0x17] = (~uVar10 | uVar4) ^ uVar2;
  s[2] = (uVar10 | uVar2) ^ uVar4;
  s[8] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x14];
  uVar2 = uVar10 ^ s[0xb] ^ s[1];
  s[0x14] = uVar2;
  uVar1 = (uVar2 << 0x25 | uVar2 >> 0x1b) ^ s[1];
  uVar4 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[1] = uVar4;
  uVar10 = s[0xb];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x31 | uVar1 >> 0xf);
  s[0x14] = (~uVar10 | uVar4) ^ uVar2;
  s[1] = (uVar10 | uVar2) ^ uVar4;
  s[0xb] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x11];
  uVar2 = uVar10 ^ s[10] ^ s[4];
  s[0x11] = uVar2;
  uVar1 = (uVar2 << 3 | uVar2 >> 0x3d) ^ s[4];
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[4] = uVar4;
  uVar10 = s[10];
  uVar10 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x17 | uVar1 >> 0x29);
  s[0x11] = (~uVar10 | uVar4) ^ uVar2;
  s[4] = (uVar10 | uVar2) ^ uVar4;
  s[10] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x16];
  uVar2 = uVar10 ^ s[0xd] ^ s[3];
  s[0x16] = uVar2;
  uVar1 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ s[3];
  uVar4 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[3] = uVar4;
  uVar10 = s[0xd];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 0x21 | uVar1 >> 0x1f);
  s[0x16] = (~uVar10 | uVar4) ^ uVar2;
  s[3] = (uVar10 | uVar2) ^ uVar4;
  s[0xd] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x13];
  uVar2 = uVar10 ^ s[0xc] ^ s[6];
  s[0x13] = uVar2;
  uVar1 = (uVar2 << 0x13 | uVar2 >> 0x2d) ^ s[6];
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[6] = uVar4;
  uVar10 = s[0xc];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 0x27 | uVar1 >> 0x19);
  s[0x13] = (~uVar10 | uVar4) ^ uVar2;
  s[6] = (uVar10 | uVar2) ^ uVar4;
  s[0xc] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x10];
  uVar2 = uVar10 ^ s[0xf] ^ s[5];
  s[0x10] = uVar2;
  uVar1 = (uVar2 << 5 | uVar2 >> 0x3b) ^ s[5];
  uVar4 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[5] = uVar4;
  uVar10 = s[0xf];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x11 | uVar1 >> 0x2f);
  s[0x10] = (~uVar10 | uVar4) ^ uVar2;
  s[5] = (uVar10 | uVar2) ^ uVar4;
  s[0xf] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x15];
  uVar2 = uVar10 ^ s[0xe] ^ *s;
  s[0x15] = uVar2;
  uVar1 = (uVar2 << 0x23 | uVar2 >> 0x1d) ^ *s;
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  *s = uVar4;
  uVar10 = s[0xe];
  uVar1 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x37 | uVar1 >> 9);
  s[0xe] = uVar1;
  s[0x15] = (~uVar1 | uVar4) ^ uVar2;
  uVar10 = (uVar1 | uVar2) ^ uVar4;
  *s = uVar10;
  s[0xe] = uVar4 & uVar2 ^ uVar1;
  s[0x17] = s[0x17] ^ 0xaad8d5034f9935a0;
  uVar4 = uVar10 ^ s[0x10] ^ s[8];
  *s = uVar4;
  uVar1 = (uVar4 << 0x35 | uVar4 >> 0xb) ^ s[8];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[8] = uVar2;
  uVar10 = s[0x10];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 1 | (ulong)((long)uVar1 < 0));
  *s = (~uVar10 | uVar2) ^ uVar4;
  s[8] = (uVar10 | uVar4) ^ uVar2;
  s[0x10] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[1];
  uVar4 = uVar10 ^ s[0x11] ^ s[9];
  s[1] = uVar4;
  uVar1 = (uVar4 << 0x33 | uVar4 >> 0xd) ^ s[9];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[9] = uVar2;
  uVar10 = s[0x11];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 7 | uVar1 >> 0x39);
  s[1] = (~uVar10 | uVar2) ^ uVar4;
  s[9] = (uVar10 | uVar4) ^ uVar2;
  s[0x11] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[2];
  uVar4 = uVar10 ^ s[0x12] ^ s[10];
  s[2] = uVar4;
  uVar1 = (uVar4 << 0x25 | uVar4 >> 0x1b) ^ s[10];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[10] = uVar2;
  uVar10 = s[0x12];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x31 | uVar1 >> 0xf);
  s[2] = (~uVar10 | uVar2) ^ uVar4;
  s[10] = (uVar10 | uVar4) ^ uVar2;
  s[0x12] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[3];
  uVar4 = uVar10 ^ s[0x13] ^ s[0xb];
  s[3] = uVar4;
  uVar1 = (uVar4 << 3 | uVar4 >> 0x3d) ^ s[0xb];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0xb] = uVar2;
  uVar10 = s[0x13];
  uVar10 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x17 | uVar1 >> 0x29);
  s[3] = (~uVar10 | uVar2) ^ uVar4;
  s[0xb] = (uVar10 | uVar4) ^ uVar2;
  s[0x13] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[4];
  uVar4 = uVar10 ^ s[0x14] ^ s[0xc];
  s[4] = uVar4;
  uVar1 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ s[0xc];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0xc] = uVar2;
  uVar10 = s[0x14];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 0x21 | uVar1 >> 0x1f);
  s[4] = (~uVar10 | uVar2) ^ uVar4;
  s[0xc] = (uVar10 | uVar4) ^ uVar2;
  s[0x14] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[5];
  uVar4 = uVar10 ^ s[0x15] ^ s[0xd];
  s[5] = uVar4;
  uVar1 = (uVar4 << 0x13 | uVar4 >> 0x2d) ^ s[0xd];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0xd] = uVar2;
  uVar10 = s[0x15];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 0x27 | uVar1 >> 0x19);
  s[5] = (~uVar10 | uVar2) ^ uVar4;
  s[0xd] = (uVar10 | uVar4) ^ uVar2;
  s[0x15] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[6];
  uVar4 = uVar10 ^ s[0x16] ^ s[0xe];
  s[6] = uVar4;
  uVar1 = (uVar4 << 5 | uVar4 >> 0x3b) ^ s[0xe];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0xe] = uVar2;
  uVar10 = s[0x16];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x11 | uVar1 >> 0x2f);
  s[6] = (~uVar10 | uVar2) ^ uVar4;
  s[0xe] = (uVar10 | uVar4) ^ uVar2;
  s[0x16] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[7];
  uVar4 = uVar10 ^ s[0x17] ^ s[0xf];
  s[7] = uVar4;
  uVar1 = (uVar4 << 0x23 | uVar4 >> 0x1d) ^ s[0xf];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0xf] = uVar2;
  uVar10 = s[0x17];
  uVar1 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x37 | uVar1 >> 9);
  s[0x17] = uVar1;
  s[7] = (~uVar1 | uVar2) ^ uVar4;
  uVar10 = (uVar1 | uVar4) ^ uVar2;
  s[0xf] = uVar10;
  s[0x17] = uVar2 & uVar4 ^ uVar1;
  s[1] = s[1] ^ 0x556c6a81a7cc9ad0;
  uVar4 = uVar10 ^ s[6] ^ s[0x11];
  s[0xf] = uVar4;
  uVar1 = (uVar4 << 0x35 | uVar4 >> 0xb) ^ s[0x11];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x11] = uVar2;
  uVar10 = s[6];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 1 | (ulong)((long)uVar1 < 0));
  s[0xf] = (~uVar10 | uVar2) ^ uVar4;
  s[0x11] = (uVar10 | uVar4) ^ uVar2;
  s[6] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[10];
  uVar4 = uVar10 ^ s[3] ^ s[0x10];
  s[10] = uVar4;
  uVar1 = (uVar4 << 0x33 | uVar4 >> 0xd) ^ s[0x10];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x10] = uVar2;
  uVar10 = s[3];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 7 | uVar1 >> 0x39);
  s[10] = (~uVar10 | uVar2) ^ uVar4;
  s[0x10] = (uVar10 | uVar4) ^ uVar2;
  s[3] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[9];
  uVar4 = uVar10 ^ *s ^ s[0x13];
  s[9] = uVar4;
  uVar1 = (uVar4 << 0x25 | uVar4 >> 0x1b) ^ s[0x13];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x13] = uVar2;
  uVar10 = *s;
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x31 | uVar1 >> 0xf);
  s[9] = (~uVar10 | uVar2) ^ uVar4;
  s[0x13] = (uVar10 | uVar4) ^ uVar2;
  *s = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xc];
  uVar4 = uVar10 ^ s[5] ^ s[0x12];
  s[0xc] = uVar4;
  uVar1 = (uVar4 << 3 | uVar4 >> 0x3d) ^ s[0x12];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x12] = uVar2;
  uVar10 = s[5];
  uVar10 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x17 | uVar1 >> 0x29);
  s[0xc] = (~uVar10 | uVar2) ^ uVar4;
  s[0x12] = (uVar10 | uVar4) ^ uVar2;
  s[5] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xb];
  uVar4 = uVar10 ^ s[2] ^ s[0x15];
  s[0xb] = uVar4;
  uVar1 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ s[0x15];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x15] = uVar2;
  uVar10 = s[2];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 0x21 | uVar1 >> 0x1f);
  s[0xb] = (~uVar10 | uVar2) ^ uVar4;
  s[0x15] = (uVar10 | uVar4) ^ uVar2;
  s[2] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xe];
  uVar4 = uVar10 ^ s[7] ^ s[0x14];
  s[0xe] = uVar4;
  uVar1 = (uVar4 << 0x13 | uVar4 >> 0x2d) ^ s[0x14];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x14] = uVar2;
  uVar10 = s[7];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 0x27 | uVar1 >> 0x19);
  s[0xe] = (~uVar10 | uVar2) ^ uVar4;
  s[0x14] = (uVar10 | uVar4) ^ uVar2;
  s[7] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xd];
  uVar4 = uVar10 ^ s[4] ^ s[0x17];
  s[0xd] = uVar4;
  uVar1 = (uVar4 << 5 | uVar4 >> 0x3b) ^ s[0x17];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x17] = uVar2;
  uVar10 = s[4];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x11 | uVar1 >> 0x2f);
  s[0xd] = (~uVar10 | uVar2) ^ uVar4;
  s[0x17] = (uVar10 | uVar4) ^ uVar2;
  s[4] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[8];
  uVar4 = uVar10 ^ s[1] ^ s[0x16];
  s[8] = uVar4;
  uVar1 = (uVar4 << 0x23 | uVar4 >> 0x1d) ^ s[0x16];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x16] = uVar2;
  uVar10 = s[1];
  uVar1 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x37 | uVar1 >> 9);
  s[1] = uVar1;
  s[8] = (~uVar1 | uVar2) ^ uVar4;
  uVar10 = (uVar1 | uVar4) ^ uVar2;
  s[0x16] = uVar10;
  s[1] = uVar2 & uVar4 ^ uVar1;
  s[10] = s[10] ^ 0x2ab63540d3e64d68;
  uVar4 = uVar10 ^ s[0xd] ^ s[3];
  s[0x16] = uVar4;
  uVar1 = (uVar4 << 0x35 | uVar4 >> 0xb) ^ s[3];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[3] = uVar2;
  uVar10 = s[0xd];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 1 | (ulong)((long)uVar1 < 0));
  s[0x16] = (~uVar10 | uVar2) ^ uVar4;
  s[3] = (uVar10 | uVar4) ^ uVar2;
  s[0xd] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0x13];
  uVar2 = uVar10 ^ s[0xc] ^ s[6];
  s[0x13] = uVar2;
  uVar1 = (uVar2 << 0x33 | uVar2 >> 0xd) ^ s[6];
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[6] = uVar4;
  uVar10 = s[0xc];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 7 | uVar1 >> 0x39);
  s[0x13] = (~uVar10 | uVar4) ^ uVar2;
  s[6] = (uVar10 | uVar2) ^ uVar4;
  s[0xc] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x10];
  uVar2 = uVar10 ^ s[0xf] ^ s[5];
  s[0x10] = uVar2;
  uVar1 = (uVar2 << 0x25 | uVar2 >> 0x1b) ^ s[5];
  uVar4 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[5] = uVar4;
  uVar10 = s[0xf];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x31 | uVar1 >> 0xf);
  s[0x10] = (~uVar10 | uVar4) ^ uVar2;
  s[5] = (uVar10 | uVar2) ^ uVar4;
  s[0xf] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x15];
  uVar2 = uVar10 ^ s[0xe] ^ *s;
  s[0x15] = uVar2;
  uVar1 = (uVar2 << 3 | uVar2 >> 0x3d) ^ *s;
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  *s = uVar4;
  uVar10 = s[0xe];
  uVar10 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x17 | uVar1 >> 0x29);
  s[0x15] = (~uVar10 | uVar4) ^ uVar2;
  *s = (uVar10 | uVar2) ^ uVar4;
  s[0xe] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x12];
  uVar2 = uVar10 ^ s[9] ^ s[7];
  s[0x12] = uVar2;
  uVar1 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ s[7];
  uVar4 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[7] = uVar4;
  uVar10 = s[9];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 0x21 | uVar1 >> 0x1f);
  s[0x12] = (~uVar10 | uVar4) ^ uVar2;
  s[7] = (uVar10 | uVar2) ^ uVar4;
  s[9] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x17];
  uVar2 = uVar10 ^ s[8] ^ s[2];
  s[0x17] = uVar2;
  uVar1 = (uVar2 << 0x13 | uVar2 >> 0x2d) ^ s[2];
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[2] = uVar4;
  uVar10 = s[8];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 0x27 | uVar1 >> 0x19);
  s[0x17] = (~uVar10 | uVar4) ^ uVar2;
  s[2] = (uVar10 | uVar2) ^ uVar4;
  s[8] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x14];
  uVar2 = uVar10 ^ s[0xb] ^ s[1];
  s[0x14] = uVar2;
  uVar1 = (uVar2 << 5 | uVar2 >> 0x3b) ^ s[1];
  uVar4 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[1] = uVar4;
  uVar10 = s[0xb];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x11 | uVar1 >> 0x2f);
  s[0x14] = (~uVar10 | uVar4) ^ uVar2;
  s[1] = (uVar10 | uVar2) ^ uVar4;
  s[0xb] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x11];
  uVar2 = uVar10 ^ s[10] ^ s[4];
  s[0x11] = uVar2;
  uVar1 = (uVar2 << 0x23 | uVar2 >> 0x1d) ^ s[4];
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[4] = uVar4;
  uVar10 = s[10];
  uVar1 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x37 | uVar1 >> 9);
  s[10] = uVar1;
  s[0x11] = (~uVar1 | uVar4) ^ uVar2;
  uVar10 = (uVar1 | uVar2) ^ uVar4;
  s[4] = uVar10;
  s[10] = uVar4 & uVar2 ^ uVar1;
  s[0x13] = s[0x13] ^ 0x155b1aa069f326b4;
  uVar4 = uVar10 ^ s[0x14] ^ s[0xc];
  s[4] = uVar4;
  uVar1 = (uVar4 << 0x35 | uVar4 >> 0xb) ^ s[0xc];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0xc] = uVar2;
  uVar10 = s[0x14];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 1 | (ulong)((long)uVar1 < 0));
  s[4] = (~uVar10 | uVar2) ^ uVar4;
  s[0xc] = (uVar10 | uVar4) ^ uVar2;
  s[0x14] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[5];
  uVar4 = uVar10 ^ s[0x15] ^ s[0xd];
  s[5] = uVar4;
  uVar1 = (uVar4 << 0x33 | uVar4 >> 0xd) ^ s[0xd];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0xd] = uVar2;
  uVar10 = s[0x15];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 7 | uVar1 >> 0x39);
  s[5] = (~uVar10 | uVar2) ^ uVar4;
  s[0xd] = (uVar10 | uVar4) ^ uVar2;
  s[0x15] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[6];
  uVar4 = uVar10 ^ s[0x16] ^ s[0xe];
  s[6] = uVar4;
  uVar1 = (uVar4 << 0x25 | uVar4 >> 0x1b) ^ s[0xe];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0xe] = uVar2;
  uVar10 = s[0x16];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x31 | uVar1 >> 0xf);
  s[6] = (~uVar10 | uVar2) ^ uVar4;
  s[0xe] = (uVar10 | uVar4) ^ uVar2;
  s[0x16] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[7];
  uVar4 = uVar10 ^ s[0x17] ^ s[0xf];
  s[7] = uVar4;
  uVar1 = (uVar4 << 3 | uVar4 >> 0x3d) ^ s[0xf];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0xf] = uVar2;
  uVar10 = s[0x17];
  uVar10 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x17 | uVar1 >> 0x29);
  s[7] = (~uVar10 | uVar2) ^ uVar4;
  s[0xf] = (uVar10 | uVar4) ^ uVar2;
  s[0x17] = uVar2 & uVar4 ^ uVar10;
  uVar10 = *s;
  uVar4 = uVar10 ^ s[0x10] ^ s[8];
  *s = uVar4;
  uVar1 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ s[8];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[8] = uVar2;
  uVar10 = s[0x10];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 0x21 | uVar1 >> 0x1f);
  *s = (~uVar10 | uVar2) ^ uVar4;
  s[8] = (uVar10 | uVar4) ^ uVar2;
  s[0x10] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[1];
  uVar4 = uVar10 ^ s[0x11] ^ s[9];
  s[1] = uVar4;
  uVar1 = (uVar4 << 0x13 | uVar4 >> 0x2d) ^ s[9];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[9] = uVar2;
  uVar10 = s[0x11];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 0x27 | uVar1 >> 0x19);
  s[1] = (~uVar10 | uVar2) ^ uVar4;
  s[9] = (uVar10 | uVar4) ^ uVar2;
  s[0x11] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[2];
  uVar4 = uVar10 ^ s[0x12] ^ s[10];
  s[2] = uVar4;
  uVar1 = (uVar4 << 5 | uVar4 >> 0x3b) ^ s[10];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[10] = uVar2;
  uVar10 = s[0x12];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x11 | uVar1 >> 0x2f);
  s[2] = (~uVar10 | uVar2) ^ uVar4;
  s[10] = (uVar10 | uVar4) ^ uVar2;
  s[0x12] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[3];
  uVar4 = uVar10 ^ s[0x13] ^ s[0xb];
  s[3] = uVar4;
  uVar1 = (uVar4 << 0x23 | uVar4 >> 0x1d) ^ s[0xb];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0xb] = uVar2;
  uVar10 = s[0x13];
  uVar1 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x37 | uVar1 >> 9);
  s[0x13] = uVar1;
  s[3] = (~uVar1 | uVar2) ^ uVar4;
  uVar10 = (uVar1 | uVar4) ^ uVar2;
  s[0xb] = uVar10;
  s[0x13] = uVar2 & uVar4 ^ uVar1;
  s[5] = s[5] ^ 0xaad8d5034f9935a;
  uVar4 = uVar10 ^ s[2] ^ s[0x15];
  s[0xb] = uVar4;
  uVar1 = (uVar4 << 0x35 | uVar4 >> 0xb) ^ s[0x15];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x15] = uVar2;
  uVar10 = s[2];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 1 | (ulong)((long)uVar1 < 0));
  s[0xb] = (~uVar10 | uVar2) ^ uVar4;
  s[0x15] = (uVar10 | uVar4) ^ uVar2;
  s[2] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xe];
  uVar4 = uVar10 ^ s[7] ^ s[0x14];
  s[0xe] = uVar4;
  uVar1 = (uVar4 << 0x33 | uVar4 >> 0xd) ^ s[0x14];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x14] = uVar2;
  uVar10 = s[7];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 7 | uVar1 >> 0x39);
  s[0xe] = (~uVar10 | uVar2) ^ uVar4;
  s[0x14] = (uVar10 | uVar4) ^ uVar2;
  s[7] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xd];
  uVar4 = uVar10 ^ s[4] ^ s[0x17];
  s[0xd] = uVar4;
  uVar1 = (uVar4 << 0x25 | uVar4 >> 0x1b) ^ s[0x17];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x17] = uVar2;
  uVar10 = s[4];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x31 | uVar1 >> 0xf);
  s[0xd] = (~uVar10 | uVar2) ^ uVar4;
  s[0x17] = (uVar10 | uVar4) ^ uVar2;
  s[4] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[8];
  uVar4 = uVar10 ^ s[1] ^ s[0x16];
  s[8] = uVar4;
  uVar1 = (uVar4 << 3 | uVar4 >> 0x3d) ^ s[0x16];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x16] = uVar2;
  uVar10 = s[1];
  uVar10 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x17 | uVar1 >> 0x29);
  s[8] = (~uVar10 | uVar2) ^ uVar4;
  s[0x16] = (uVar10 | uVar4) ^ uVar2;
  s[1] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xf];
  uVar4 = uVar10 ^ s[6] ^ s[0x11];
  s[0xf] = uVar4;
  uVar1 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ s[0x11];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x11] = uVar2;
  uVar10 = s[6];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 0x21 | uVar1 >> 0x1f);
  s[0xf] = (~uVar10 | uVar2) ^ uVar4;
  s[0x11] = (uVar10 | uVar4) ^ uVar2;
  s[6] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[10];
  uVar4 = uVar10 ^ s[3] ^ s[0x10];
  s[10] = uVar4;
  uVar1 = (uVar4 << 0x13 | uVar4 >> 0x2d) ^ s[0x10];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x10] = uVar2;
  uVar10 = s[3];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 0x27 | uVar1 >> 0x19);
  s[10] = (~uVar10 | uVar2) ^ uVar4;
  s[0x10] = (uVar10 | uVar4) ^ uVar2;
  s[3] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[9];
  uVar4 = uVar10 ^ *s ^ s[0x13];
  s[9] = uVar4;
  uVar1 = (uVar4 << 5 | uVar4 >> 0x3b) ^ s[0x13];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[0x13] = uVar2;
  uVar10 = *s;
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x11 | uVar1 >> 0x2f);
  s[9] = (~uVar10 | uVar2) ^ uVar4;
  s[0x13] = (uVar10 | uVar4) ^ uVar2;
  *s = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0xc];
  uVar4 = uVar10 ^ s[5] ^ s[0x12];
  s[0xc] = uVar4;
  uVar1 = (uVar4 << 0x23 | uVar4 >> 0x1d) ^ s[0x12];
  uVar2 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[0x12] = uVar2;
  uVar10 = s[5];
  uVar1 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x37 | uVar1 >> 9);
  s[5] = uVar1;
  s[0xc] = (~uVar1 | uVar2) ^ uVar4;
  uVar10 = (uVar1 | uVar4) ^ uVar2;
  s[0x12] = uVar10;
  s[5] = uVar2 & uVar4 ^ uVar1;
  s[0xe] = s[0xe] ^ 0x556c6a81a7cc9ad;
  uVar4 = uVar10 ^ s[9] ^ s[7];
  s[0x12] = uVar4;
  uVar1 = (uVar4 << 0x35 | uVar4 >> 0xb) ^ s[7];
  uVar2 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[7] = uVar2;
  uVar10 = s[9];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 1 | (ulong)((long)uVar1 < 0));
  s[0x12] = (~uVar10 | uVar2) ^ uVar4;
  s[7] = (uVar10 | uVar4) ^ uVar2;
  s[9] = uVar2 & uVar4 ^ uVar10;
  uVar10 = s[0x17];
  uVar2 = uVar10 ^ s[8] ^ s[2];
  s[0x17] = uVar2;
  uVar1 = (uVar2 << 0x33 | uVar2 >> 0xd) ^ s[2];
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[2] = uVar4;
  uVar10 = s[8];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 7 | uVar1 >> 0x39);
  s[0x17] = (~uVar10 | uVar4) ^ uVar2;
  s[2] = (uVar10 | uVar2) ^ uVar4;
  s[8] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x14];
  uVar2 = uVar10 ^ s[0xb] ^ s[1];
  s[0x14] = uVar2;
  uVar1 = (uVar2 << 0x25 | uVar2 >> 0x1b) ^ s[1];
  uVar4 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[1] = uVar4;
  uVar10 = s[0xb];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x31 | uVar1 >> 0xf);
  s[0x14] = (~uVar10 | uVar4) ^ uVar2;
  s[1] = (uVar10 | uVar2) ^ uVar4;
  s[0xb] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x11];
  uVar2 = uVar10 ^ s[10] ^ s[4];
  s[0x11] = uVar2;
  uVar1 = (uVar2 << 3 | uVar2 >> 0x3d) ^ s[4];
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[4] = uVar4;
  uVar10 = s[10];
  uVar10 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x17 | uVar1 >> 0x29);
  s[0x11] = (~uVar10 | uVar4) ^ uVar2;
  s[4] = (uVar10 | uVar2) ^ uVar4;
  s[10] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x16];
  uVar2 = uVar10 ^ s[0xd] ^ s[3];
  s[0x16] = uVar2;
  uVar1 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ s[3];
  uVar4 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[3] = uVar4;
  uVar10 = s[0xd];
  uVar10 = (uVar10 << 0xe | uVar10 >> 0x32) ^ uVar10 ^ (uVar1 << 0x21 | uVar1 >> 0x1f);
  s[0x16] = (~uVar10 | uVar4) ^ uVar2;
  s[3] = (uVar10 | uVar2) ^ uVar4;
  s[0xd] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x13];
  uVar2 = uVar10 ^ s[0xc] ^ s[6];
  s[0x13] = uVar2;
  uVar1 = (uVar2 << 0x13 | uVar2 >> 0x2d) ^ s[6];
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  s[6] = uVar4;
  uVar10 = s[0xc];
  uVar10 = (uVar10 << 0x22 | uVar10 >> 0x1e) ^ uVar10 ^ (uVar1 << 0x27 | uVar1 >> 0x19);
  s[0x13] = (~uVar10 | uVar4) ^ uVar2;
  s[6] = (uVar10 | uVar2) ^ uVar4;
  s[0xc] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x10];
  uVar2 = uVar10 ^ s[0xf] ^ s[5];
  s[0x10] = uVar2;
  uVar1 = (uVar2 << 5 | uVar2 >> 0x3b) ^ s[5];
  uVar4 = (uVar10 << 8 | uVar10 >> 0x38) ^ uVar1;
  s[5] = uVar4;
  uVar10 = s[0xf];
  uVar10 = (uVar10 << 0x2e | uVar10 >> 0x12) ^ uVar10 ^ (uVar1 << 0x11 | uVar1 >> 0x2f);
  s[0x10] = (~uVar10 | uVar4) ^ uVar2;
  s[5] = (uVar10 | uVar2) ^ uVar4;
  s[0xf] = uVar4 & uVar2 ^ uVar10;
  uVar10 = s[0x15];
  uVar2 = uVar10 ^ s[0xe] ^ *s;
  s[0x15] = uVar2;
  uVar1 = (uVar2 << 0x23 | uVar2 >> 0x1d) ^ *s;
  uVar4 = (uVar10 << 0x38 | uVar10 >> 8) ^ uVar1;
  *s = uVar4;
  uVar10 = s[0xe];
  uVar10 = (uVar10 << 2 | uVar10 >> 0x3e) ^ uVar10 ^ (uVar1 << 0x37 | uVar1 >> 9);
  s[0x15] = (~uVar10 | uVar4) ^ uVar2;
  *s = (uVar10 | uVar2) ^ uVar4;
  s[0xe] = uVar4 & uVar2 ^ uVar10;
  s[0x17] = s[0x17] ^ 0xde8082cd72debc78;
  return;
}

Assistant:

static void bashF0(u64 s[24])
{
	register u64 t0;
	register u64 t1;
	register u64 t2;
	bashR(s, P0, P1,  1, t0, t1, t2);
	bashR(s, P1, P2,  2, t0, t1, t2);
	bashR(s, P2, P3,  3, t0, t1, t2);
	bashR(s, P3, P4,  4, t0, t1, t2);
	bashR(s, P4, P5,  5, t0, t1, t2);
	bashR(s, P5, P0,  6, t0, t1, t2);
	bashR(s, P0, P1,  7, t0, t1, t2);
	bashR(s, P1, P2,  8, t0, t1, t2);
	bashR(s, P2, P3,  9, t0, t1, t2);
	bashR(s, P3, P4, 10, t0, t1, t2);
	bashR(s, P4, P5, 11, t0, t1, t2);
	bashR(s, P5, P0, 12, t0, t1, t2);
	bashR(s, P0, P1, 13, t0, t1, t2);
	bashR(s, P1, P2, 14, t0, t1, t2);
	bashR(s, P2, P3, 15, t0, t1, t2);
	bashR(s, P3, P4, 16, t0, t1, t2);
	bashR(s, P4, P5, 17, t0, t1, t2);
	bashR(s, P5, P0, 18, t0, t1, t2);
	bashR(s, P0, P1, 19, t0, t1, t2);
	bashR(s, P1, P2, 20, t0, t1, t2);
	bashR(s, P2, P3, 21, t0, t1, t2);
	bashR(s, P3, P4, 22, t0, t1, t2);
	bashR(s, P4, P5, 23, t0, t1, t2);
	bashR(s, P5, P0, 24, t0, t1, t2);
	t0 = t1 = t2 = 0;
}